

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint uVar63;
  uint uVar64;
  ulong uVar65;
  byte bVar66;
  uint uVar67;
  ulong uVar68;
  long lVar69;
  uint uVar70;
  long lVar71;
  uint uVar72;
  bool bVar73;
  float fVar74;
  float fVar75;
  float fVar114;
  float fVar115;
  vint4 bi_1;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar116;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar91 [16];
  undefined1 auVar107 [32];
  undefined1 auVar92 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  vint4 bi;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar128 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar151;
  float fVar183;
  float fVar184;
  vint4 bi_2;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar185;
  float fVar199;
  float fVar200;
  vint4 ai_1;
  undefined1 auVar186 [16];
  float fVar201;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  float fVar202;
  float fVar229;
  float fVar230;
  vint4 ai_2;
  undefined1 auVar203 [16];
  float fVar231;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar232;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar233;
  float fVar250;
  float fVar251;
  undefined1 auVar234 [16];
  float fVar252;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar262 [16];
  vint4 ai;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [32];
  float fVar291;
  float fVar301;
  float fVar302;
  undefined1 auVar292 [16];
  float fVar303;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar304;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [32];
  float fVar311;
  float fVar312;
  float fVar319;
  float fVar321;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  float fVar320;
  float fVar322;
  float fVar323;
  float fVar324;
  undefined1 auVar318 [32];
  float fVar325;
  float fVar330;
  float fVar331;
  undefined1 auVar326 [16];
  float fVar332;
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar342;
  float fVar343;
  undefined1 auVar338 [16];
  float fVar344;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  float fVar345;
  vfloat4 a0;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  float fVar354;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar355 [16];
  float fVar359;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_630 [8];
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  uint local_548;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  uint auStack_4a0 [4];
  RTCFilterFunctionNArguments local_490;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  float afStack_320 [8];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar261 [32];
  undefined1 auVar353 [32];
  
  PVar11 = prim[1];
  uVar65 = (ulong)(byte)PVar11;
  lVar69 = uVar65 * 0x25;
  fVar75 = *(float *)(prim + lVar69 + 0x12);
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar124 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar124 = vinsertps_avx(auVar124,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar88 = vsubps_avx(auVar88,*(undefined1 (*) [16])(prim + lVar69 + 6));
  auVar117._0_4_ = fVar75 * auVar88._0_4_;
  auVar117._4_4_ = fVar75 * auVar88._4_4_;
  auVar117._8_4_ = fVar75 * auVar88._8_4_;
  auVar117._12_4_ = fVar75 * auVar88._12_4_;
  auVar263._0_4_ = fVar75 * auVar124._0_4_;
  auVar263._4_4_ = fVar75 * auVar124._4_4_;
  auVar263._8_4_ = fVar75 * auVar124._8_4_;
  auVar263._12_4_ = fVar75 * auVar124._12_4_;
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 4 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar124 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 5 + 6)));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar178 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 6 + 6)));
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar281 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xf + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar281 = vcvtdq2ps_avx(auVar281);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar65 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1a + 6)));
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1b + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1c + 6)));
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar131 = vshufps_avx(auVar263,auVar263,0);
  auVar262 = vshufps_avx(auVar263,auVar263,0x55);
  auVar20 = vshufps_avx(auVar263,auVar263,0xaa);
  fVar75 = auVar20._0_4_;
  fVar151 = auVar20._4_4_;
  fVar183 = auVar20._8_4_;
  fVar184 = auVar20._12_4_;
  fVar202 = auVar262._0_4_;
  fVar229 = auVar262._4_4_;
  fVar230 = auVar262._8_4_;
  fVar231 = auVar262._12_4_;
  fVar185 = auVar131._0_4_;
  fVar199 = auVar131._4_4_;
  fVar200 = auVar131._8_4_;
  fVar201 = auVar131._12_4_;
  auVar326._0_4_ = fVar185 * auVar88._0_4_ + fVar202 * auVar124._0_4_ + fVar75 * auVar178._0_4_;
  auVar326._4_4_ = fVar199 * auVar88._4_4_ + fVar229 * auVar124._4_4_ + fVar151 * auVar178._4_4_;
  auVar326._8_4_ = fVar200 * auVar88._8_4_ + fVar230 * auVar124._8_4_ + fVar183 * auVar178._8_4_;
  auVar326._12_4_ = fVar201 * auVar88._12_4_ + fVar231 * auVar124._12_4_ + fVar184 * auVar178._12_4_
  ;
  auVar338._0_4_ = fVar185 * auVar281._0_4_ + fVar202 * auVar18._0_4_ + auVar19._0_4_ * fVar75;
  auVar338._4_4_ = fVar199 * auVar281._4_4_ + fVar229 * auVar18._4_4_ + auVar19._4_4_ * fVar151;
  auVar338._8_4_ = fVar200 * auVar281._8_4_ + fVar230 * auVar18._8_4_ + auVar19._8_4_ * fVar183;
  auVar338._12_4_ = fVar201 * auVar281._12_4_ + fVar231 * auVar18._12_4_ + auVar19._12_4_ * fVar184;
  auVar264._0_4_ = fVar185 * auVar141._0_4_ + fVar202 * auVar130._0_4_ + auVar168._0_4_ * fVar75;
  auVar264._4_4_ = fVar199 * auVar141._4_4_ + fVar229 * auVar130._4_4_ + auVar168._4_4_ * fVar151;
  auVar264._8_4_ = fVar200 * auVar141._8_4_ + fVar230 * auVar130._8_4_ + auVar168._8_4_ * fVar183;
  auVar264._12_4_ =
       fVar201 * auVar141._12_4_ + fVar231 * auVar130._12_4_ + auVar168._12_4_ * fVar184;
  auVar131 = vshufps_avx(auVar117,auVar117,0);
  auVar262 = vshufps_avx(auVar117,auVar117,0x55);
  auVar20 = vshufps_avx(auVar117,auVar117,0xaa);
  fVar75 = auVar20._0_4_;
  fVar151 = auVar20._4_4_;
  fVar183 = auVar20._8_4_;
  fVar184 = auVar20._12_4_;
  fVar202 = auVar262._0_4_;
  fVar229 = auVar262._4_4_;
  fVar230 = auVar262._8_4_;
  fVar231 = auVar262._12_4_;
  fVar185 = auVar131._0_4_;
  fVar199 = auVar131._4_4_;
  fVar200 = auVar131._8_4_;
  fVar201 = auVar131._12_4_;
  auVar118._0_4_ = fVar185 * auVar88._0_4_ + fVar202 * auVar124._0_4_ + fVar75 * auVar178._0_4_;
  auVar118._4_4_ = fVar199 * auVar88._4_4_ + fVar229 * auVar124._4_4_ + fVar151 * auVar178._4_4_;
  auVar118._8_4_ = fVar200 * auVar88._8_4_ + fVar230 * auVar124._8_4_ + fVar183 * auVar178._8_4_;
  auVar118._12_4_ = fVar201 * auVar88._12_4_ + fVar231 * auVar124._12_4_ + fVar184 * auVar178._12_4_
  ;
  auVar76._0_4_ = fVar185 * auVar281._0_4_ + auVar19._0_4_ * fVar75 + fVar202 * auVar18._0_4_;
  auVar76._4_4_ = fVar199 * auVar281._4_4_ + auVar19._4_4_ * fVar151 + fVar229 * auVar18._4_4_;
  auVar76._8_4_ = fVar200 * auVar281._8_4_ + auVar19._8_4_ * fVar183 + fVar230 * auVar18._8_4_;
  auVar76._12_4_ = fVar201 * auVar281._12_4_ + auVar19._12_4_ * fVar184 + fVar231 * auVar18._12_4_;
  auVar273._8_4_ = 0x7fffffff;
  auVar273._0_8_ = 0x7fffffff7fffffff;
  auVar273._12_4_ = 0x7fffffff;
  auVar88 = vandps_avx(auVar326,auVar273);
  auVar203._8_4_ = 0x219392ef;
  auVar203._0_8_ = 0x219392ef219392ef;
  auVar203._12_4_ = 0x219392ef;
  auVar88 = vcmpps_avx(auVar88,auVar203,1);
  auVar124 = vblendvps_avx(auVar326,auVar203,auVar88);
  auVar88 = vandps_avx(auVar338,auVar273);
  auVar88 = vcmpps_avx(auVar88,auVar203,1);
  auVar178 = vblendvps_avx(auVar338,auVar203,auVar88);
  auVar88 = vandps_avx(auVar273,auVar264);
  auVar88 = vcmpps_avx(auVar88,auVar203,1);
  auVar88 = vblendvps_avx(auVar264,auVar203,auVar88);
  auVar152._0_4_ = fVar185 * auVar141._0_4_ + fVar202 * auVar130._0_4_ + auVar168._0_4_ * fVar75;
  auVar152._4_4_ = fVar199 * auVar141._4_4_ + fVar229 * auVar130._4_4_ + auVar168._4_4_ * fVar151;
  auVar152._8_4_ = fVar200 * auVar141._8_4_ + fVar230 * auVar130._8_4_ + auVar168._8_4_ * fVar183;
  auVar152._12_4_ =
       fVar201 * auVar141._12_4_ + fVar231 * auVar130._12_4_ + auVar168._12_4_ * fVar184;
  auVar281 = vrcpps_avx(auVar124);
  fVar185 = auVar281._0_4_;
  auVar186._0_4_ = fVar185 * auVar124._0_4_;
  fVar199 = auVar281._4_4_;
  auVar186._4_4_ = fVar199 * auVar124._4_4_;
  fVar200 = auVar281._8_4_;
  auVar186._8_4_ = fVar200 * auVar124._8_4_;
  fVar201 = auVar281._12_4_;
  auVar186._12_4_ = fVar201 * auVar124._12_4_;
  auVar274._8_4_ = 0x3f800000;
  auVar274._0_8_ = 0x3f8000003f800000;
  auVar274._12_4_ = 0x3f800000;
  auVar124 = vsubps_avx(auVar274,auVar186);
  fVar185 = fVar185 + fVar185 * auVar124._0_4_;
  fVar199 = fVar199 + fVar199 * auVar124._4_4_;
  fVar200 = fVar200 + fVar200 * auVar124._8_4_;
  fVar201 = fVar201 + fVar201 * auVar124._12_4_;
  auVar124 = vrcpps_avx(auVar178);
  fVar202 = auVar124._0_4_;
  auVar234._0_4_ = fVar202 * auVar178._0_4_;
  fVar229 = auVar124._4_4_;
  auVar234._4_4_ = fVar229 * auVar178._4_4_;
  fVar230 = auVar124._8_4_;
  auVar234._8_4_ = fVar230 * auVar178._8_4_;
  fVar231 = auVar124._12_4_;
  auVar234._12_4_ = fVar231 * auVar178._12_4_;
  auVar124 = vsubps_avx(auVar274,auVar234);
  fVar202 = fVar202 + fVar202 * auVar124._0_4_;
  fVar229 = fVar229 + fVar229 * auVar124._4_4_;
  fVar230 = fVar230 + fVar230 * auVar124._8_4_;
  fVar231 = fVar231 + fVar231 * auVar124._12_4_;
  auVar124 = vrcpps_avx(auVar88);
  fVar233 = auVar124._0_4_;
  auVar253._0_4_ = fVar233 * auVar88._0_4_;
  fVar250 = auVar124._4_4_;
  auVar253._4_4_ = fVar250 * auVar88._4_4_;
  fVar251 = auVar124._8_4_;
  auVar253._8_4_ = fVar251 * auVar88._8_4_;
  fVar252 = auVar124._12_4_;
  auVar253._12_4_ = fVar252 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar274,auVar253);
  fVar233 = fVar233 + fVar233 * auVar88._0_4_;
  fVar250 = fVar250 + fVar250 * auVar88._4_4_;
  fVar251 = fVar251 + fVar251 * auVar88._8_4_;
  fVar252 = fVar252 + fVar252 * auVar88._12_4_;
  auVar88 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar69 + 0x16)) *
                          *(float *)(prim + lVar69 + 0x1a)));
  auVar178 = vshufps_avx(auVar88,auVar88,0);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar65 * 7 + 6);
  auVar88 = vpmovsxwd_avx(auVar88);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar65 * 0xb + 6);
  auVar124 = vpmovsxwd_avx(auVar124);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar281 = vsubps_avx(auVar124,auVar88);
  fVar75 = auVar178._0_4_;
  fVar151 = auVar178._4_4_;
  fVar183 = auVar178._8_4_;
  fVar184 = auVar178._12_4_;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + uVar65 * 9 + 6);
  auVar124 = vpmovsxwd_avx(auVar178);
  auVar265._0_4_ = auVar281._0_4_ * fVar75 + auVar88._0_4_;
  auVar265._4_4_ = auVar281._4_4_ * fVar151 + auVar88._4_4_;
  auVar265._8_4_ = auVar281._8_4_ * fVar183 + auVar88._8_4_;
  auVar265._12_4_ = auVar281._12_4_ * fVar184 + auVar88._12_4_;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = *(ulong *)(prim + uVar65 * 0xd + 6);
  auVar178 = vpmovsxwd_avx(auVar281);
  auVar88 = vcvtdq2ps_avx(auVar124);
  auVar124 = vcvtdq2ps_avx(auVar178);
  auVar124 = vsubps_avx(auVar124,auVar88);
  auVar275._0_4_ = auVar124._0_4_ * fVar75 + auVar88._0_4_;
  auVar275._4_4_ = auVar124._4_4_ * fVar151 + auVar88._4_4_;
  auVar275._8_4_ = auVar124._8_4_ * fVar183 + auVar88._8_4_;
  auVar275._12_4_ = auVar124._12_4_ * fVar184 + auVar88._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar65 * 0x12 + 6);
  auVar88 = vpmovsxwd_avx(auVar18);
  uVar68 = (ulong)(uint)((int)(uVar65 * 5) << 2);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar65 * 2 + uVar68 + 6);
  auVar124 = vpmovsxwd_avx(auVar19);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,auVar88);
  auVar292._0_4_ = auVar124._0_4_ * fVar75 + auVar88._0_4_;
  auVar292._4_4_ = auVar124._4_4_ * fVar151 + auVar88._4_4_;
  auVar292._8_4_ = auVar124._8_4_ * fVar183 + auVar88._8_4_;
  auVar292._12_4_ = auVar124._12_4_ * fVar184 + auVar88._12_4_;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar88 = vpmovsxwd_avx(auVar141);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar65 * 0x18 + 6);
  auVar124 = vpmovsxwd_avx(auVar130);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar178 = vsubps_avx(auVar124,auVar88);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar65 * 0x1d + 6);
  auVar124 = vpmovsxwd_avx(auVar168);
  auVar305._0_4_ = auVar178._0_4_ * fVar75 + auVar88._0_4_;
  auVar305._4_4_ = auVar178._4_4_ * fVar151 + auVar88._4_4_;
  auVar305._8_4_ = auVar178._8_4_ * fVar183 + auVar88._8_4_;
  auVar305._12_4_ = auVar178._12_4_ * fVar184 + auVar88._12_4_;
  auVar88 = vcvtdq2ps_avx(auVar124);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar65 + (ulong)(byte)PVar11 * 0x20 + 6);
  auVar124 = vpmovsxwd_avx(auVar131);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,auVar88);
  auVar313._0_4_ = auVar124._0_4_ * fVar75 + auVar88._0_4_;
  auVar313._4_4_ = auVar124._4_4_ * fVar151 + auVar88._4_4_;
  auVar313._8_4_ = auVar124._8_4_ * fVar183 + auVar88._8_4_;
  auVar313._12_4_ = auVar124._12_4_ * fVar184 + auVar88._12_4_;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar65) + 6);
  auVar88 = vpmovsxwd_avx(auVar262);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar65 * 0x23 + 6);
  auVar124 = vpmovsxwd_avx(auVar20);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,auVar88);
  auVar254._0_4_ = auVar88._0_4_ + auVar124._0_4_ * fVar75;
  auVar254._4_4_ = auVar88._4_4_ + auVar124._4_4_ * fVar151;
  auVar254._8_4_ = auVar88._8_4_ + auVar124._8_4_ * fVar183;
  auVar254._12_4_ = auVar88._12_4_ + auVar124._12_4_ * fVar184;
  auVar88 = vsubps_avx(auVar265,auVar118);
  auVar266._0_4_ = fVar185 * auVar88._0_4_;
  auVar266._4_4_ = fVar199 * auVar88._4_4_;
  auVar266._8_4_ = fVar200 * auVar88._8_4_;
  auVar266._12_4_ = fVar201 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar275,auVar118);
  auVar119._0_4_ = fVar185 * auVar88._0_4_;
  auVar119._4_4_ = fVar199 * auVar88._4_4_;
  auVar119._8_4_ = fVar200 * auVar88._8_4_;
  auVar119._12_4_ = fVar201 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar292,auVar76);
  auVar187._0_4_ = fVar202 * auVar88._0_4_;
  auVar187._4_4_ = fVar229 * auVar88._4_4_;
  auVar187._8_4_ = fVar230 * auVar88._8_4_;
  auVar187._12_4_ = fVar231 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar305,auVar76);
  auVar77._0_4_ = fVar202 * auVar88._0_4_;
  auVar77._4_4_ = fVar229 * auVar88._4_4_;
  auVar77._8_4_ = fVar230 * auVar88._8_4_;
  auVar77._12_4_ = fVar231 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar313,auVar152);
  auVar204._0_4_ = fVar233 * auVar88._0_4_;
  auVar204._4_4_ = fVar250 * auVar88._4_4_;
  auVar204._8_4_ = fVar251 * auVar88._8_4_;
  auVar204._12_4_ = fVar252 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar254,auVar152);
  auVar153._0_4_ = fVar233 * auVar88._0_4_;
  auVar153._4_4_ = fVar250 * auVar88._4_4_;
  auVar153._8_4_ = fVar251 * auVar88._8_4_;
  auVar153._12_4_ = fVar252 * auVar88._12_4_;
  auVar88 = vpminsd_avx(auVar266,auVar119);
  auVar124 = vpminsd_avx(auVar187,auVar77);
  auVar88 = vmaxps_avx(auVar88,auVar124);
  auVar124 = vpminsd_avx(auVar204,auVar153);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar276._4_4_ = uVar9;
  auVar276._0_4_ = uVar9;
  auVar276._8_4_ = uVar9;
  auVar276._12_4_ = uVar9;
  auVar124 = vmaxps_avx(auVar124,auVar276);
  auVar88 = vmaxps_avx(auVar88,auVar124);
  local_410._0_4_ = auVar88._0_4_ * 0.99999964;
  local_410._4_4_ = auVar88._4_4_ * 0.99999964;
  local_410._8_4_ = auVar88._8_4_ * 0.99999964;
  local_410._12_4_ = auVar88._12_4_ * 0.99999964;
  auVar88 = vpmaxsd_avx(auVar266,auVar119);
  auVar124 = vpmaxsd_avx(auVar187,auVar77);
  auVar88 = vminps_avx(auVar88,auVar124);
  auVar124 = vpmaxsd_avx(auVar204,auVar153);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar154._4_4_ = uVar9;
  auVar154._0_4_ = uVar9;
  auVar154._8_4_ = uVar9;
  auVar154._12_4_ = uVar9;
  auVar124 = vminps_avx(auVar124,auVar154);
  auVar88 = vminps_avx(auVar88,auVar124);
  auVar87._0_4_ = auVar88._0_4_ * 1.0000004;
  auVar87._4_4_ = auVar88._4_4_ * 1.0000004;
  auVar87._8_4_ = auVar88._8_4_ * 1.0000004;
  auVar87._12_4_ = auVar88._12_4_ * 1.0000004;
  auVar88 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar124 = vpcmpgtd_avx(auVar88,_DAT_01f7fcf0);
  auVar88 = vcmpps_avx(local_410,auVar87,2);
  auVar88 = vandps_avx(auVar88,auVar124);
  uVar63 = vmovmskps_avx(auVar88);
  if (uVar63 == 0) {
    return false;
  }
  uVar63 = uVar63 & 0xff;
  auVar107._16_16_ = mm_lookupmask_ps._240_16_;
  auVar107._0_16_ = mm_lookupmask_ps._240_16_;
  local_2c0 = vblendps_avx(auVar107,ZEXT832(0) << 0x20,0x80);
  uVar64 = 1 << ((byte)k & 0x1f);
LAB_00f2cd04:
  lVar69 = 0;
  if (uVar63 != 0) {
    for (; (uVar63 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
    }
  }
  uVar67 = *(uint *)(prim + 2);
  pGVar12 = (context->scene->geometries).items[uVar67].ptr;
  fVar75 = (pGVar12->time_range).lower;
  fVar75 = pGVar12->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar75) / ((pGVar12->time_range).upper - fVar75));
  auVar88 = vroundss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75),9);
  auVar88 = vminss_avx(auVar88,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar88 = vmaxss_avx(ZEXT816(0) << 0x20,auVar88);
  uVar65 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           (ulong)*(uint *)(prim + lVar69 * 4 + 6) *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar71 = (long)(int)auVar88._0_4_ * 0x38;
  lVar14 = *(long *)(_Var13 + lVar71);
  lVar15 = *(long *)(_Var13 + 0x10 + lVar71);
  pfVar4 = (float *)(lVar14 + lVar15 * uVar65);
  fVar151 = *pfVar4;
  fVar183 = pfVar4[1];
  fVar184 = pfVar4[2];
  fVar185 = pfVar4[3];
  lVar1 = uVar65 + 1;
  pfVar4 = (float *)(lVar14 + lVar15 * lVar1);
  lVar2 = uVar65 + 2;
  pfVar5 = (float *)(lVar14 + lVar15 * lVar2);
  lVar3 = uVar65 + 3;
  pfVar6 = (float *)(lVar14 + lVar15 * lVar3);
  fVar199 = *pfVar6;
  fVar200 = pfVar6[1];
  fVar201 = pfVar6[2];
  fVar202 = pfVar6[3];
  lVar14 = *(long *)&pGVar12[4].fnumTimeSegments;
  lVar15 = *(long *)(lVar14 + lVar71);
  lVar16 = *(long *)(lVar14 + 0x10 + lVar71);
  pfVar6 = (float *)(lVar15 + lVar16 * uVar65);
  fVar229 = *pfVar6;
  fVar230 = pfVar6[1];
  fVar231 = pfVar6[2];
  fVar233 = pfVar6[3];
  pfVar6 = (float *)(lVar15 + lVar16 * lVar1);
  pfVar7 = (float *)(lVar15 + lVar16 * lVar2);
  fVar75 = fVar75 - auVar88._0_4_;
  pfVar8 = (float *)(lVar15 + lVar16 * lVar3);
  fVar250 = *pfVar8;
  fVar251 = pfVar8[1];
  fVar252 = pfVar8[2];
  fVar232 = pfVar8[3];
  fVar291 = *pfVar5 * 0.0;
  fVar301 = pfVar5[1] * 0.0;
  fVar302 = pfVar5[2] * 0.0;
  fVar303 = pfVar5[3] * 0.0;
  fVar74 = fVar291 + fVar199 * 0.0;
  fVar114 = fVar301 + fVar200 * 0.0;
  fVar115 = fVar302 + fVar201 * 0.0;
  fVar116 = fVar303 + fVar202 * 0.0;
  fVar311 = *pfVar4 * 0.0;
  fVar319 = pfVar4[1] * 0.0;
  fVar321 = pfVar4[2] * 0.0;
  fVar323 = pfVar4[3] * 0.0;
  local_6e0._0_4_ = fVar151 + fVar311 + fVar74;
  local_6e0._4_4_ = fVar183 + fVar319 + fVar114;
  fStack_6d8 = fVar184 + fVar321 + fVar115;
  fStack_6d4 = fVar185 + fVar323 + fVar116;
  auVar78._0_4_ = *pfVar4 * 3.0 + fVar74;
  auVar78._4_4_ = pfVar4[1] * 3.0 + fVar114;
  auVar78._8_4_ = pfVar4[2] * 3.0 + fVar115;
  auVar78._12_4_ = pfVar4[3] * 3.0 + fVar116;
  auVar155._0_4_ = fVar151 * 3.0;
  auVar155._4_4_ = fVar183 * 3.0;
  auVar155._8_4_ = fVar184 * 3.0;
  auVar155._12_4_ = fVar185 * 3.0;
  auVar130 = vsubps_avx(auVar78,auVar155);
  fVar325 = *pfVar7 * 0.0;
  fVar330 = pfVar7[1] * 0.0;
  fVar331 = pfVar7[2] * 0.0;
  fVar332 = pfVar7[3] * 0.0;
  fVar74 = fVar325 + fVar250 * 0.0;
  fVar114 = fVar330 + fVar251 * 0.0;
  fVar115 = fVar331 + fVar252 * 0.0;
  fVar116 = fVar332 + fVar232 * 0.0;
  fVar337 = *pfVar6 * 0.0;
  fVar342 = pfVar6[1] * 0.0;
  fVar343 = pfVar6[2] * 0.0;
  fVar344 = pfVar6[3] * 0.0;
  auVar346._0_4_ = fVar337 + fVar74 + fVar229;
  auVar346._4_4_ = fVar342 + fVar114 + fVar230;
  auVar346._8_4_ = fVar343 + fVar115 + fVar231;
  auVar346._12_4_ = fVar344 + fVar116 + fVar233;
  auVar79._0_4_ = *pfVar6 * 3.0 + fVar74;
  auVar79._4_4_ = pfVar6[1] * 3.0 + fVar114;
  auVar79._8_4_ = pfVar6[2] * 3.0 + fVar115;
  auVar79._12_4_ = pfVar6[3] * 3.0 + fVar116;
  auVar255._0_4_ = fVar229 * 3.0;
  auVar255._4_4_ = fVar230 * 3.0;
  auVar255._8_4_ = fVar231 * 3.0;
  auVar255._12_4_ = fVar233 * 3.0;
  auVar281 = vsubps_avx(auVar79,auVar255);
  auVar188._0_4_ = fVar151 * 0.0;
  auVar188._4_4_ = fVar183 * 0.0;
  auVar188._8_4_ = fVar184 * 0.0;
  auVar188._12_4_ = fVar185 * 0.0;
  auVar256._0_4_ = auVar188._0_4_ + fVar311 + fVar291 + fVar199;
  auVar256._4_4_ = auVar188._4_4_ + fVar319 + fVar301 + fVar200;
  auVar256._8_4_ = auVar188._8_4_ + fVar321 + fVar302 + fVar201;
  auVar256._12_4_ = auVar188._12_4_ + fVar323 + fVar303 + fVar202;
  auVar267._0_4_ = fVar199 * 3.0;
  auVar267._4_4_ = fVar200 * 3.0;
  auVar267._8_4_ = fVar201 * 3.0;
  auVar267._12_4_ = fVar202 * 3.0;
  auVar205._0_4_ = *pfVar5 * 3.0;
  auVar205._4_4_ = pfVar5[1] * 3.0;
  auVar205._8_4_ = pfVar5[2] * 3.0;
  auVar205._12_4_ = pfVar5[3] * 3.0;
  auVar88 = vsubps_avx(auVar267,auVar205);
  auVar206._0_4_ = fVar311 + auVar88._0_4_;
  auVar206._4_4_ = fVar319 + auVar88._4_4_;
  auVar206._8_4_ = fVar321 + auVar88._8_4_;
  auVar206._12_4_ = fVar323 + auVar88._12_4_;
  auVar168 = vsubps_avx(auVar206,auVar188);
  auVar207._0_4_ = fVar229 * 0.0;
  auVar207._4_4_ = fVar230 * 0.0;
  auVar207._8_4_ = fVar231 * 0.0;
  auVar207._12_4_ = fVar233 * 0.0;
  auVar189._0_4_ = auVar207._0_4_ + fVar337 + fVar325 + fVar250;
  auVar189._4_4_ = auVar207._4_4_ + fVar342 + fVar330 + fVar251;
  auVar189._8_4_ = auVar207._8_4_ + fVar343 + fVar331 + fVar252;
  auVar189._12_4_ = auVar207._12_4_ + fVar344 + fVar332 + fVar232;
  auVar235._0_4_ = fVar250 * 3.0;
  auVar235._4_4_ = fVar251 * 3.0;
  auVar235._8_4_ = fVar252 * 3.0;
  auVar235._12_4_ = fVar232 * 3.0;
  auVar268._0_4_ = *pfVar7 * 3.0;
  auVar268._4_4_ = pfVar7[1] * 3.0;
  auVar268._8_4_ = pfVar7[2] * 3.0;
  auVar268._12_4_ = pfVar7[3] * 3.0;
  auVar88 = vsubps_avx(auVar235,auVar268);
  auVar236._0_4_ = fVar337 + auVar88._0_4_;
  auVar236._4_4_ = fVar342 + auVar88._4_4_;
  auVar236._8_4_ = fVar343 + auVar88._8_4_;
  auVar236._12_4_ = fVar344 + auVar88._12_4_;
  auVar19 = vsubps_avx(auVar236,auVar207);
  auVar88 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar124 = vshufps_avx(auVar346,auVar346,0xc9);
  fVar74 = auVar130._0_4_;
  auVar237._0_4_ = fVar74 * auVar124._0_4_;
  fVar114 = auVar130._4_4_;
  auVar237._4_4_ = fVar114 * auVar124._4_4_;
  fVar115 = auVar130._8_4_;
  auVar237._8_4_ = fVar115 * auVar124._8_4_;
  fVar116 = auVar130._12_4_;
  auVar237._12_4_ = fVar116 * auVar124._12_4_;
  auVar277._0_4_ = auVar346._0_4_ * auVar88._0_4_;
  auVar277._4_4_ = auVar346._4_4_ * auVar88._4_4_;
  auVar277._8_4_ = auVar346._8_4_ * auVar88._8_4_;
  auVar277._12_4_ = auVar346._12_4_ * auVar88._12_4_;
  auVar124 = vsubps_avx(auVar277,auVar237);
  auVar178 = vshufps_avx(auVar124,auVar124,0xc9);
  auVar124 = vshufps_avx(auVar281,auVar281,0xc9);
  auVar278._0_4_ = auVar124._0_4_ * fVar74;
  auVar278._4_4_ = auVar124._4_4_ * fVar114;
  auVar278._8_4_ = auVar124._8_4_ * fVar115;
  auVar278._12_4_ = auVar124._12_4_ * fVar116;
  auVar80._0_4_ = auVar88._0_4_ * auVar281._0_4_;
  auVar80._4_4_ = auVar88._4_4_ * auVar281._4_4_;
  auVar80._8_4_ = auVar88._8_4_ * auVar281._8_4_;
  auVar80._12_4_ = auVar88._12_4_ * auVar281._12_4_;
  auVar88 = vsubps_avx(auVar80,auVar278);
  auVar281 = vshufps_avx(auVar88,auVar88,0xc9);
  auVar124 = vshufps_avx(auVar168,auVar168,0xc9);
  auVar88 = vshufps_avx(auVar189,auVar189,0xc9);
  fVar337 = auVar168._0_4_;
  auVar279._0_4_ = fVar337 * auVar88._0_4_;
  fVar342 = auVar168._4_4_;
  auVar279._4_4_ = fVar342 * auVar88._4_4_;
  fVar343 = auVar168._8_4_;
  auVar279._8_4_ = fVar343 * auVar88._8_4_;
  fVar344 = auVar168._12_4_;
  auVar279._12_4_ = fVar344 * auVar88._12_4_;
  auVar190._0_4_ = auVar124._0_4_ * auVar189._0_4_;
  auVar190._4_4_ = auVar124._4_4_ * auVar189._4_4_;
  auVar190._8_4_ = auVar124._8_4_ * auVar189._8_4_;
  auVar190._12_4_ = auVar124._12_4_ * auVar189._12_4_;
  auVar88 = vsubps_avx(auVar190,auVar279);
  auVar18 = vshufps_avx(auVar88,auVar88,0xc9);
  auVar88 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar280._0_4_ = fVar337 * auVar88._0_4_;
  auVar280._4_4_ = fVar342 * auVar88._4_4_;
  auVar280._8_4_ = fVar343 * auVar88._8_4_;
  auVar280._12_4_ = fVar344 * auVar88._12_4_;
  auVar88 = vdpps_avx(auVar178,auVar178,0x7f);
  auVar208._0_4_ = auVar124._0_4_ * auVar19._0_4_;
  auVar208._4_4_ = auVar124._4_4_ * auVar19._4_4_;
  auVar208._8_4_ = auVar124._8_4_ * auVar19._8_4_;
  auVar208._12_4_ = auVar124._12_4_ * auVar19._12_4_;
  auVar124 = vsubps_avx(auVar208,auVar280);
  auVar19 = vshufps_avx(auVar124,auVar124,0xc9);
  fVar183 = auVar88._0_4_;
  auVar262 = ZEXT416((uint)fVar183);
  auVar124 = vrsqrtss_avx(auVar262,auVar262);
  fVar151 = auVar124._0_4_;
  auVar124 = ZEXT416((uint)(fVar151 * 1.5 - fVar183 * 0.5 * fVar151 * fVar151 * fVar151));
  auVar141 = vshufps_avx(auVar124,auVar124,0);
  auVar124 = vdpps_avx(auVar178,auVar281,0x7f);
  fVar250 = auVar141._0_4_ * auVar178._0_4_;
  fVar251 = auVar141._4_4_ * auVar178._4_4_;
  fVar252 = auVar141._8_4_ * auVar178._8_4_;
  fVar232 = auVar141._12_4_ * auVar178._12_4_;
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar81._0_4_ = auVar88._0_4_ * auVar281._0_4_;
  auVar81._4_4_ = auVar88._4_4_ * auVar281._4_4_;
  auVar81._8_4_ = auVar88._8_4_ * auVar281._8_4_;
  auVar81._12_4_ = auVar88._12_4_ * auVar281._12_4_;
  auVar88 = vshufps_avx(auVar124,auVar124,0);
  auVar238._0_4_ = auVar88._0_4_ * auVar178._0_4_;
  auVar238._4_4_ = auVar88._4_4_ * auVar178._4_4_;
  auVar238._8_4_ = auVar88._8_4_ * auVar178._8_4_;
  auVar238._12_4_ = auVar88._12_4_ * auVar178._12_4_;
  auVar131 = vsubps_avx(auVar81,auVar238);
  auVar88 = vrcpss_avx(auVar262,auVar262);
  auVar88 = ZEXT416((uint)(auVar88._0_4_ * (2.0 - fVar183 * auVar88._0_4_)));
  auVar178 = vshufps_avx(auVar88,auVar88,0);
  auVar88 = vdpps_avx(auVar18,auVar18,0x7f);
  fVar291 = auVar88._0_4_;
  auVar281 = ZEXT416((uint)fVar291);
  auVar124 = vrsqrtss_avx(auVar281,auVar281);
  fVar229 = auVar124._0_4_;
  auVar124 = vdpps_avx(auVar18,auVar19,0x7f);
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar355._0_4_ = auVar19._0_4_ * auVar88._0_4_;
  auVar355._4_4_ = auVar19._4_4_ * auVar88._4_4_;
  auVar355._8_4_ = auVar19._8_4_ * auVar88._8_4_;
  auVar355._12_4_ = auVar19._12_4_ * auVar88._12_4_;
  lVar15 = *(long *)(_Var13 + 0x38 + lVar71);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar71);
  pfVar4 = (float *)(lVar15 + lVar16 * uVar65);
  fVar151 = *pfVar4;
  fVar183 = pfVar4[1];
  fVar184 = pfVar4[2];
  fVar185 = pfVar4[3];
  pfVar4 = (float *)(lVar15 + lVar16 * lVar1);
  pfVar5 = (float *)(lVar15 + lVar16 * lVar2);
  auVar88 = vshufps_avx(auVar124,auVar124,0);
  auVar82._0_4_ = auVar18._0_4_ * auVar88._0_4_;
  auVar82._4_4_ = auVar18._4_4_ * auVar88._4_4_;
  auVar82._8_4_ = auVar18._8_4_ * auVar88._8_4_;
  auVar82._12_4_ = auVar18._12_4_ * auVar88._12_4_;
  auVar19 = vsubps_avx(auVar355,auVar82);
  pfVar6 = (float *)(lVar15 + lVar16 * lVar3);
  fVar199 = *pfVar6;
  fVar200 = pfVar6[1];
  fVar201 = pfVar6[2];
  fVar202 = pfVar6[3];
  auVar88 = ZEXT416((uint)(fVar229 * 1.5 - fVar291 * 0.5 * fVar229 * fVar229 * fVar229));
  auVar124 = vshufps_avx(auVar88,auVar88,0);
  fVar229 = auVar124._0_4_ * auVar18._0_4_;
  fVar230 = auVar124._4_4_ * auVar18._4_4_;
  fVar231 = auVar124._8_4_ * auVar18._8_4_;
  fVar233 = auVar124._12_4_ * auVar18._12_4_;
  auVar88 = vrcpss_avx(auVar281,auVar281);
  auVar88 = ZEXT416((uint)(auVar88._0_4_ * (2.0 - auVar88._0_4_ * fVar291)));
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar281 = vshufps_avx(_local_6e0,_local_6e0,0xff);
  auVar347._0_4_ = auVar281._0_4_ * fVar250;
  auVar347._4_4_ = auVar281._4_4_ * fVar251;
  auVar347._8_4_ = auVar281._8_4_ * fVar252;
  auVar347._12_4_ = auVar281._12_4_ * fVar232;
  auVar18 = vshufps_avx(auVar130,auVar130,0xff);
  auVar262 = vsubps_avx(_local_6e0,auVar347);
  auVar269._0_4_ =
       auVar18._0_4_ * fVar250 + auVar281._0_4_ * auVar141._0_4_ * auVar131._0_4_ * auVar178._0_4_;
  auVar269._4_4_ =
       auVar18._4_4_ * fVar251 + auVar281._4_4_ * auVar141._4_4_ * auVar131._4_4_ * auVar178._4_4_;
  auVar269._8_4_ =
       auVar18._8_4_ * fVar252 + auVar281._8_4_ * auVar141._8_4_ * auVar131._8_4_ * auVar178._8_4_;
  auVar269._12_4_ =
       auVar18._12_4_ * fVar232 +
       auVar281._12_4_ * auVar141._12_4_ * auVar131._12_4_ * auVar178._12_4_;
  auVar141 = vsubps_avx(auVar130,auVar269);
  local_6e0._0_4_ = (float)local_6e0._0_4_ + auVar347._0_4_;
  local_6e0._4_4_ = (float)local_6e0._4_4_ + auVar347._4_4_;
  fStack_6d8 = fStack_6d8 + auVar347._8_4_;
  fStack_6d4 = fStack_6d4 + auVar347._12_4_;
  auVar178 = vshufps_avx(auVar256,auVar256,0xff);
  auVar156._0_4_ = auVar178._0_4_ * fVar229;
  auVar156._4_4_ = auVar178._4_4_ * fVar230;
  auVar156._8_4_ = auVar178._8_4_ * fVar231;
  auVar156._12_4_ = auVar178._12_4_ * fVar233;
  auVar281 = vshufps_avx(auVar168,auVar168,0xff);
  auVar130 = vsubps_avx(auVar256,auVar156);
  auVar83._0_4_ =
       auVar281._0_4_ * fVar229 + auVar178._0_4_ * auVar124._0_4_ * auVar19._0_4_ * auVar88._0_4_;
  auVar83._4_4_ =
       auVar281._4_4_ * fVar230 + auVar178._4_4_ * auVar124._4_4_ * auVar19._4_4_ * auVar88._4_4_;
  auVar83._8_4_ =
       auVar281._8_4_ * fVar231 + auVar178._8_4_ * auVar124._8_4_ * auVar19._8_4_ * auVar88._8_4_;
  auVar83._12_4_ =
       auVar281._12_4_ * fVar233 +
       auVar178._12_4_ * auVar124._12_4_ * auVar19._12_4_ * auVar88._12_4_;
  auVar168 = vsubps_avx(auVar168,auVar83);
  local_630._4_4_ = auVar256._4_4_ + auVar156._4_4_;
  local_630._0_4_ = auVar256._0_4_ + auVar156._0_4_;
  fStack_628 = auVar256._8_4_ + auVar156._8_4_;
  fStack_624 = auVar256._12_4_ + auVar156._12_4_;
  fVar311 = *pfVar5 * 0.0;
  fVar319 = pfVar5[1] * 0.0;
  fVar321 = pfVar5[2] * 0.0;
  fVar323 = pfVar5[3] * 0.0;
  fVar354 = fVar311 + fVar199 * 0.0;
  fVar356 = fVar319 + fVar200 * 0.0;
  fVar357 = fVar321 + fVar201 * 0.0;
  fVar359 = fVar323 + fVar202 * 0.0;
  auVar84._0_4_ = fVar354 + *pfVar4 * 3.0;
  auVar84._4_4_ = fVar356 + pfVar4[1] * 3.0;
  auVar84._8_4_ = fVar357 + pfVar4[2] * 3.0;
  auVar84._12_4_ = fVar359 + pfVar4[3] * 3.0;
  auVar157._0_4_ = fVar151 * 3.0;
  auVar157._4_4_ = fVar183 * 3.0;
  auVar157._8_4_ = fVar184 * 3.0;
  auVar157._12_4_ = fVar185 * 3.0;
  auVar131 = vsubps_avx(auVar84,auVar157);
  lVar15 = *(long *)(lVar14 + 0x38 + lVar71);
  lVar14 = *(long *)(lVar14 + 0x48 + lVar71);
  auVar88 = *(undefined1 (*) [16])(lVar15 + lVar2 * lVar14);
  pfVar6 = (float *)(lVar15 + lVar14 * lVar3);
  fVar229 = *pfVar6;
  fVar230 = pfVar6[1];
  fVar231 = pfVar6[2];
  fVar233 = pfVar6[3];
  fVar291 = auVar88._0_4_ * 0.0;
  fVar301 = auVar88._4_4_ * 0.0;
  fVar302 = auVar88._8_4_ * 0.0;
  fVar303 = auVar88._12_4_ * 0.0;
  fVar325 = fVar291 + fVar229 * 0.0;
  fVar330 = fVar301 + fVar230 * 0.0;
  fVar331 = fVar302 + fVar231 * 0.0;
  fVar332 = fVar303 + fVar233 * 0.0;
  pfVar6 = (float *)(lVar15 + lVar1 * lVar14);
  auVar348._0_4_ = *pfVar6 * 3.0 + fVar325;
  auVar348._4_4_ = pfVar6[1] * 3.0 + fVar330;
  auVar348._8_4_ = pfVar6[2] * 3.0 + fVar331;
  auVar348._12_4_ = pfVar6[3] * 3.0 + fVar332;
  pfVar7 = (float *)(lVar15 + uVar65 * lVar14);
  fVar250 = *pfVar7;
  fVar251 = pfVar7[1];
  fVar252 = pfVar7[2];
  fVar232 = pfVar7[3];
  auVar282._0_4_ = fVar250 * 3.0;
  auVar282._4_4_ = fVar251 * 3.0;
  auVar282._8_4_ = fVar252 * 3.0;
  auVar282._12_4_ = fVar232 * 3.0;
  auVar124 = vsubps_avx(auVar348,auVar282);
  auVar283._0_4_ = fVar199 * 3.0;
  auVar283._4_4_ = fVar200 * 3.0;
  auVar283._8_4_ = fVar201 * 3.0;
  auVar283._12_4_ = fVar202 * 3.0;
  auVar327._0_4_ = *pfVar5 * 3.0;
  auVar327._4_4_ = pfVar5[1] * 3.0;
  auVar327._8_4_ = pfVar5[2] * 3.0;
  auVar327._12_4_ = pfVar5[3] * 3.0;
  auVar178 = vsubps_avx(auVar283,auVar327);
  fVar312 = *pfVar4 * 0.0;
  fVar320 = pfVar4[1] * 0.0;
  fVar322 = pfVar4[2] * 0.0;
  fVar324 = pfVar4[3] * 0.0;
  auVar284._0_4_ = fVar312 + auVar178._0_4_;
  auVar284._4_4_ = fVar320 + auVar178._4_4_;
  auVar284._8_4_ = fVar322 + auVar178._8_4_;
  auVar284._12_4_ = fVar324 + auVar178._12_4_;
  auVar328._0_4_ = fVar151 + fVar312 + fVar354;
  auVar328._4_4_ = fVar183 + fVar320 + fVar356;
  auVar328._8_4_ = fVar184 + fVar322 + fVar357;
  auVar328._12_4_ = fVar185 + fVar324 + fVar359;
  auVar306._0_4_ = fVar151 * 0.0;
  auVar306._4_4_ = fVar183 * 0.0;
  auVar306._8_4_ = fVar184 * 0.0;
  auVar306._12_4_ = fVar185 * 0.0;
  local_700._0_4_ = auVar306._0_4_ + fVar312 + fVar199 + fVar311;
  local_700._4_4_ = auVar306._4_4_ + fVar320 + fVar200 + fVar319;
  fStack_6f8 = auVar306._8_4_ + fVar322 + fVar201 + fVar321;
  fStack_6f4 = auVar306._12_4_ + fVar324 + fVar202 + fVar323;
  auVar20 = vsubps_avx(auVar284,auVar306);
  auVar120._0_4_ = fVar229 * 3.0;
  auVar120._4_4_ = fVar230 * 3.0;
  auVar120._8_4_ = fVar231 * 3.0;
  auVar120._12_4_ = fVar233 * 3.0;
  auVar209._0_4_ = auVar88._0_4_ * 3.0;
  auVar209._4_4_ = auVar88._4_4_ * 3.0;
  auVar209._8_4_ = auVar88._8_4_ * 3.0;
  auVar209._12_4_ = auVar88._12_4_ * 3.0;
  auVar88 = vsubps_avx(auVar120,auVar209);
  fVar151 = *pfVar6 * 0.0;
  fVar183 = pfVar6[1] * 0.0;
  fVar184 = pfVar6[2] * 0.0;
  fVar185 = pfVar6[3] * 0.0;
  auVar121._0_4_ = fVar151 + auVar88._0_4_;
  auVar121._4_4_ = fVar183 + auVar88._4_4_;
  auVar121._8_4_ = fVar184 + auVar88._8_4_;
  auVar121._12_4_ = fVar185 + auVar88._12_4_;
  auVar158._0_4_ = fVar250 + fVar151 + fVar325;
  auVar158._4_4_ = fVar251 + fVar183 + fVar330;
  auVar158._8_4_ = fVar252 + fVar184 + fVar331;
  auVar158._12_4_ = fVar232 + fVar185 + fVar332;
  auVar85._0_4_ = fVar250 * 0.0;
  auVar85._4_4_ = fVar251 * 0.0;
  auVar85._8_4_ = fVar252 * 0.0;
  auVar85._12_4_ = fVar232 * 0.0;
  auVar191._0_4_ = auVar85._0_4_ + fVar151 + fVar291 + fVar229;
  auVar191._4_4_ = auVar85._4_4_ + fVar183 + fVar301 + fVar230;
  auVar191._8_4_ = auVar85._8_4_ + fVar184 + fVar302 + fVar231;
  auVar191._12_4_ = auVar85._12_4_ + fVar185 + fVar303 + fVar233;
  auVar281 = vsubps_avx(auVar121,auVar85);
  auVar88 = vshufps_avx(auVar158,auVar158,0xc9);
  fVar202 = auVar131._0_4_;
  auVar122._0_4_ = fVar202 * auVar88._0_4_;
  fVar229 = auVar131._4_4_;
  auVar122._4_4_ = fVar229 * auVar88._4_4_;
  fVar230 = auVar131._8_4_;
  auVar122._8_4_ = fVar230 * auVar88._8_4_;
  fVar231 = auVar131._12_4_;
  auVar122._12_4_ = fVar231 * auVar88._12_4_;
  auVar88 = vshufps_avx(auVar131,auVar131,0xc9);
  auVar159._0_4_ = auVar88._0_4_ * auVar158._0_4_;
  auVar159._4_4_ = auVar88._4_4_ * auVar158._4_4_;
  auVar159._8_4_ = auVar88._8_4_ * auVar158._8_4_;
  auVar159._12_4_ = auVar88._12_4_ * auVar158._12_4_;
  auVar178 = vsubps_avx(auVar159,auVar122);
  auVar160._0_4_ = auVar124._0_4_ * auVar88._0_4_;
  auVar160._4_4_ = auVar124._4_4_ * auVar88._4_4_;
  auVar160._8_4_ = auVar124._8_4_ * auVar88._8_4_;
  auVar160._12_4_ = auVar124._12_4_ * auVar88._12_4_;
  auVar88 = vshufps_avx(auVar124,auVar124,0xc9);
  auVar210._0_4_ = fVar202 * auVar88._0_4_;
  auVar210._4_4_ = fVar229 * auVar88._4_4_;
  auVar210._8_4_ = fVar230 * auVar88._8_4_;
  auVar210._12_4_ = fVar231 * auVar88._12_4_;
  auVar18 = vsubps_avx(auVar160,auVar210);
  auVar88 = vshufps_avx(auVar191,auVar191,0xc9);
  fVar233 = auVar20._0_4_;
  auVar211._0_4_ = fVar233 * auVar88._0_4_;
  fVar250 = auVar20._4_4_;
  auVar211._4_4_ = fVar250 * auVar88._4_4_;
  fVar251 = auVar20._8_4_;
  auVar211._8_4_ = fVar251 * auVar88._8_4_;
  fVar252 = auVar20._12_4_;
  auVar211._12_4_ = fVar252 * auVar88._12_4_;
  auVar88 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar192._0_4_ = auVar88._0_4_ * auVar191._0_4_;
  auVar192._4_4_ = auVar88._4_4_ * auVar191._4_4_;
  auVar192._8_4_ = auVar88._8_4_ * auVar191._8_4_;
  auVar192._12_4_ = auVar88._12_4_ * auVar191._12_4_;
  auVar19 = vsubps_avx(auVar192,auVar211);
  auVar178 = vshufps_avx(auVar178,auVar178,0xc9);
  auVar123._0_4_ = auVar88._0_4_ * auVar281._0_4_;
  auVar123._4_4_ = auVar88._4_4_ * auVar281._4_4_;
  auVar123._8_4_ = auVar88._8_4_ * auVar281._8_4_;
  auVar123._12_4_ = auVar88._12_4_ * auVar281._12_4_;
  auVar88 = vdpps_avx(auVar178,auVar178,0x7f);
  auVar124 = vshufps_avx(auVar281,auVar281,0xc9);
  auVar86._0_4_ = fVar233 * auVar124._0_4_;
  auVar86._4_4_ = fVar250 * auVar124._4_4_;
  auVar86._8_4_ = fVar251 * auVar124._8_4_;
  auVar86._12_4_ = fVar252 * auVar124._12_4_;
  auVar76 = vsubps_avx(auVar123,auVar86);
  fVar183 = auVar88._0_4_;
  auVar87 = ZEXT416((uint)fVar183);
  auVar124 = vrsqrtss_avx(auVar87,auVar87);
  fVar151 = auVar124._0_4_;
  auVar281 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar124 = vdpps_avx(auVar178,auVar281,0x7f);
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar161._0_4_ = auVar88._0_4_ * auVar281._0_4_;
  auVar161._4_4_ = auVar88._4_4_ * auVar281._4_4_;
  auVar161._8_4_ = auVar88._8_4_ * auVar281._8_4_;
  auVar161._12_4_ = auVar88._12_4_ * auVar281._12_4_;
  auVar88 = vshufps_avx(auVar124,auVar124,0);
  auVar212._0_4_ = auVar178._0_4_ * auVar88._0_4_;
  auVar212._4_4_ = auVar178._4_4_ * auVar88._4_4_;
  auVar212._8_4_ = auVar178._8_4_ * auVar88._8_4_;
  auVar212._12_4_ = auVar178._12_4_ * auVar88._12_4_;
  auVar77 = vsubps_avx(auVar161,auVar212);
  auVar88 = vrcpss_avx(auVar87,auVar87);
  auVar88 = ZEXT416((uint)(auVar88._0_4_ * (2.0 - fVar183 * auVar88._0_4_)));
  auVar281 = vshufps_avx(auVar88,auVar88,0);
  auVar18 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar88 = vdpps_avx(auVar18,auVar18,0x7f);
  auVar124 = ZEXT416((uint)(fVar151 * 1.5 - fVar183 * 0.5 * fVar151 * fVar151 * fVar151));
  auVar19 = vshufps_avx(auVar124,auVar124,0);
  fVar199 = auVar178._0_4_ * auVar19._0_4_;
  fVar200 = auVar178._4_4_ * auVar19._4_4_;
  fVar201 = auVar178._8_4_ * auVar19._8_4_;
  fVar232 = auVar178._12_4_ * auVar19._12_4_;
  fVar183 = auVar88._0_4_;
  auVar87 = ZEXT416((uint)fVar183);
  auVar124 = vrsqrtss_avx(auVar87,auVar87);
  fVar151 = auVar124._0_4_;
  auVar178 = vshufps_avx(auVar76,auVar76,0xc9);
  auVar124 = vdpps_avx(auVar18,auVar178,0x7f);
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar213._0_4_ = auVar88._0_4_ * auVar178._0_4_;
  auVar213._4_4_ = auVar88._4_4_ * auVar178._4_4_;
  auVar213._8_4_ = auVar88._8_4_ * auVar178._8_4_;
  auVar213._12_4_ = auVar88._12_4_ * auVar178._12_4_;
  auVar88 = vshufps_avx(auVar124,auVar124,0);
  auVar239._0_4_ = auVar18._0_4_ * auVar88._0_4_;
  auVar239._4_4_ = auVar18._4_4_ * auVar88._4_4_;
  auVar239._8_4_ = auVar18._8_4_ * auVar88._8_4_;
  auVar239._12_4_ = auVar18._12_4_ * auVar88._12_4_;
  auVar76 = vsubps_avx(auVar213,auVar239);
  auVar88 = vrcpss_avx(auVar87,auVar87);
  auVar88 = ZEXT416((uint)(auVar88._0_4_ * (2.0 - fVar183 * auVar88._0_4_)));
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar124 = ZEXT416((uint)(fVar151 * 1.5 - fVar183 * 0.5 * fVar151 * fVar151 * fVar151));
  auVar124 = vshufps_avx(auVar124,auVar124,0);
  fVar151 = auVar18._0_4_ * auVar124._0_4_;
  fVar183 = auVar18._4_4_ * auVar124._4_4_;
  fVar184 = auVar18._8_4_ * auVar124._8_4_;
  fVar185 = auVar18._12_4_ * auVar124._12_4_;
  auVar178 = vshufps_avx(auVar131,auVar131,0xff);
  auVar18 = vshufps_avx(auVar328,auVar328,0xff);
  auVar214._0_4_ = fVar199 * auVar18._0_4_;
  auVar214._4_4_ = fVar200 * auVar18._4_4_;
  auVar214._8_4_ = fVar201 * auVar18._8_4_;
  auVar214._12_4_ = fVar232 * auVar18._12_4_;
  auVar125._0_4_ =
       fVar199 * auVar178._0_4_ + auVar19._0_4_ * auVar77._0_4_ * auVar281._0_4_ * auVar18._0_4_;
  auVar125._4_4_ =
       fVar200 * auVar178._4_4_ + auVar19._4_4_ * auVar77._4_4_ * auVar281._4_4_ * auVar18._4_4_;
  auVar125._8_4_ =
       fVar201 * auVar178._8_4_ + auVar19._8_4_ * auVar77._8_4_ * auVar281._8_4_ * auVar18._8_4_;
  auVar125._12_4_ =
       fVar232 * auVar178._12_4_ +
       auVar19._12_4_ * auVar77._12_4_ * auVar281._12_4_ * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar328,auVar214);
  auVar19 = vsubps_avx(auVar131,auVar125);
  auVar178 = vshufps_avx(auVar20,auVar20,0xff);
  auVar281 = vshufps_avx(_local_700,_local_700,0xff);
  auVar162._0_4_ = auVar281._0_4_ * fVar151;
  auVar162._4_4_ = auVar281._4_4_ * fVar183;
  auVar162._8_4_ = auVar281._8_4_ * fVar184;
  auVar162._12_4_ = auVar281._12_4_ * fVar185;
  auVar89._0_4_ =
       auVar178._0_4_ * fVar151 + auVar281._0_4_ * auVar124._0_4_ * auVar76._0_4_ * auVar88._0_4_;
  auVar89._4_4_ =
       auVar178._4_4_ * fVar183 + auVar281._4_4_ * auVar124._4_4_ * auVar76._4_4_ * auVar88._4_4_;
  auVar89._8_4_ =
       auVar178._8_4_ * fVar184 + auVar281._8_4_ * auVar124._8_4_ * auVar76._8_4_ * auVar88._8_4_;
  auVar89._12_4_ =
       auVar178._12_4_ * fVar185 +
       auVar281._12_4_ * auVar124._12_4_ * auVar76._12_4_ * auVar88._12_4_;
  auVar178 = vsubps_avx(_local_700,auVar162);
  auVar339._0_4_ = (float)local_700._0_4_ + auVar162._0_4_;
  auVar339._4_4_ = (float)local_700._4_4_ + auVar162._4_4_;
  auVar339._8_4_ = fStack_6f8 + auVar162._8_4_;
  auVar339._12_4_ = fStack_6f4 + auVar162._12_4_;
  auVar281 = vsubps_avx(auVar20,auVar89);
  local_620 = auVar141._0_4_;
  fStack_61c = auVar141._4_4_;
  fStack_618 = auVar141._8_4_;
  fStack_614 = auVar141._12_4_;
  local_600 = auVar262._0_4_;
  fStack_5fc = auVar262._4_4_;
  fStack_5f8 = auVar262._8_4_;
  fStack_5f4 = auVar262._12_4_;
  auVar88 = vshufps_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75),0);
  auVar124 = vshufps_avx(ZEXT416((uint)(1.0 - fVar75)),ZEXT416((uint)(1.0 - fVar75)),0);
  fVar185 = auVar88._0_4_;
  fVar199 = auVar88._4_4_;
  fVar200 = auVar88._8_4_;
  fVar201 = auVar88._12_4_;
  fVar75 = auVar124._0_4_;
  fVar151 = auVar124._4_4_;
  fVar183 = auVar124._8_4_;
  fVar184 = auVar124._12_4_;
  local_4d0._0_4_ = fVar75 * local_600 + fVar185 * auVar18._0_4_;
  local_4d0._4_4_ = fVar151 * fStack_5fc + fVar199 * auVar18._4_4_;
  fStack_4c8 = fVar183 * fStack_5f8 + fVar200 * auVar18._8_4_;
  fStack_4c4 = fVar184 * fStack_5f4 + fVar201 * auVar18._12_4_;
  fVar291 = fVar75 * (local_600 + local_620 * 0.33333334) +
            fVar185 * (auVar18._0_4_ + auVar19._0_4_ * 0.33333334);
  fVar301 = fVar151 * (fStack_5fc + fStack_61c * 0.33333334) +
            fVar199 * (auVar18._4_4_ + auVar19._4_4_ * 0.33333334);
  fVar302 = fVar183 * (fStack_5f8 + fStack_618 * 0.33333334) +
            fVar200 * (auVar18._8_4_ + auVar19._8_4_ * 0.33333334);
  fVar303 = fVar184 * (fStack_5f4 + fStack_614 * 0.33333334) +
            fVar201 * (auVar18._12_4_ + auVar19._12_4_ * 0.33333334);
  local_6a0 = auVar168._0_4_;
  fStack_69c = auVar168._4_4_;
  fStack_698 = auVar168._8_4_;
  fStack_694 = auVar168._12_4_;
  auVar193._0_4_ = local_6a0 * 0.33333334;
  auVar193._4_4_ = fStack_69c * 0.33333334;
  auVar193._8_4_ = fStack_698 * 0.33333334;
  auVar193._12_4_ = fStack_694 * 0.33333334;
  auVar88 = vsubps_avx(auVar130,auVar193);
  auVar240._0_4_ = (fVar337 + auVar83._0_4_) * 0.33333334;
  auVar240._4_4_ = (fVar342 + auVar83._4_4_) * 0.33333334;
  auVar240._8_4_ = (fVar343 + auVar83._8_4_) * 0.33333334;
  auVar240._12_4_ = (fVar344 + auVar83._12_4_) * 0.33333334;
  auVar124 = vsubps_avx(_local_630,auVar240);
  auVar163._0_4_ = auVar281._0_4_ * 0.33333334;
  auVar163._4_4_ = auVar281._4_4_ * 0.33333334;
  auVar163._8_4_ = auVar281._8_4_ * 0.33333334;
  auVar163._12_4_ = auVar281._12_4_ * 0.33333334;
  auVar281 = vsubps_avx(auVar178,auVar163);
  auVar126._0_4_ = (fVar233 + auVar89._0_4_) * 0.33333334;
  auVar126._4_4_ = (fVar250 + auVar89._4_4_) * 0.33333334;
  auVar126._8_4_ = (fVar251 + auVar89._8_4_) * 0.33333334;
  auVar126._12_4_ = (fVar252 + auVar89._12_4_) * 0.33333334;
  auVar18 = vsubps_avx(auVar339,auVar126);
  local_4e0._0_4_ = fVar75 * auVar88._0_4_ + fVar185 * auVar281._0_4_;
  local_4e0._4_4_ = fVar151 * auVar88._4_4_ + fVar199 * auVar281._4_4_;
  fStack_4d8 = fVar183 * auVar88._8_4_ + fVar200 * auVar281._8_4_;
  fStack_4d4 = fVar184 * auVar88._12_4_ + fVar201 * auVar281._12_4_;
  local_4f0._0_4_ = fVar185 * auVar178._0_4_ + auVar130._0_4_ * fVar75;
  local_4f0._4_4_ = fVar199 * auVar178._4_4_ + auVar130._4_4_ * fVar151;
  fStack_4e8 = fVar200 * auVar178._8_4_ + auVar130._8_4_ * fVar183;
  fStack_4e4 = fVar201 * auVar178._12_4_ + auVar130._12_4_ * fVar184;
  local_500._0_4_ = fVar75 * (float)local_6e0._0_4_ + fVar185 * (auVar328._0_4_ + auVar214._0_4_);
  local_500._4_4_ = fVar151 * (float)local_6e0._4_4_ + fVar199 * (auVar328._4_4_ + auVar214._4_4_);
  fStack_4f8 = fVar183 * fStack_6d8 + fVar200 * (auVar328._8_4_ + auVar214._8_4_);
  fStack_4f4 = fVar184 * fStack_6d4 + fVar201 * (auVar328._12_4_ + auVar214._12_4_);
  local_510._0_4_ =
       fVar75 * ((float)local_6e0._0_4_ + (fVar74 + auVar269._0_4_) * 0.33333334) +
       fVar185 * (auVar328._0_4_ + auVar214._0_4_ + (fVar202 + auVar125._0_4_) * 0.33333334);
  local_510._4_4_ =
       fVar151 * ((float)local_6e0._4_4_ + (fVar114 + auVar269._4_4_) * 0.33333334) +
       fVar199 * (auVar328._4_4_ + auVar214._4_4_ + (fVar229 + auVar125._4_4_) * 0.33333334);
  fStack_508 = fVar183 * (fStack_6d8 + (fVar115 + auVar269._8_4_) * 0.33333334) +
               fVar200 * (auVar328._8_4_ + auVar214._8_4_ + (fVar230 + auVar125._8_4_) * 0.33333334)
  ;
  fStack_504 = fVar184 * (fStack_6d4 + (fVar116 + auVar269._12_4_) * 0.33333334) +
               fVar201 * (auVar328._12_4_ + auVar214._12_4_ +
                         (fVar231 + auVar125._12_4_) * 0.33333334);
  local_420._0_4_ = fVar75 * auVar124._0_4_ + fVar185 * auVar18._0_4_;
  local_420._4_4_ = fVar151 * auVar124._4_4_ + fVar199 * auVar18._4_4_;
  fStack_418 = fVar183 * auVar124._8_4_ + fVar200 * auVar18._8_4_;
  fStack_414 = fVar184 * auVar124._12_4_ + fVar201 * auVar18._12_4_;
  fVar233 = (auVar256._0_4_ + auVar156._0_4_) * fVar75 + fVar185 * auVar339._0_4_;
  fVar251 = (auVar256._4_4_ + auVar156._4_4_) * fVar151 + fVar199 * auVar339._4_4_;
  fVar232 = (auVar256._8_4_ + auVar156._8_4_) * fVar183 + fVar200 * auVar339._8_4_;
  fVar74 = (auVar256._12_4_ + auVar156._12_4_) * fVar184 + fVar201 * auVar339._12_4_;
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_380 = vsubps_avx(_local_4d0,auVar88);
  auVar178 = vmovsldup_avx(local_380);
  auVar124 = vmovshdup_avx(local_380);
  auVar281 = vshufps_avx(local_380,local_380,0xaa);
  fVar75 = pre->ray_space[k].vx.field_0.m128[0];
  fVar151 = pre->ray_space[k].vx.field_0.m128[1];
  fVar183 = pre->ray_space[k].vx.field_0.m128[2];
  fVar184 = pre->ray_space[k].vx.field_0.m128[3];
  fVar185 = pre->ray_space[k].vy.field_0.m128[0];
  fVar199 = pre->ray_space[k].vy.field_0.m128[1];
  fVar200 = pre->ray_space[k].vy.field_0.m128[2];
  fVar201 = pre->ray_space[k].vy.field_0.m128[3];
  fVar202 = pre->ray_space[k].vz.field_0.m128[0];
  fVar229 = pre->ray_space[k].vz.field_0.m128[1];
  fVar230 = pre->ray_space[k].vz.field_0.m128[2];
  fVar231 = pre->ray_space[k].vz.field_0.m128[3];
  local_6f0._0_4_ = fVar75 * auVar178._0_4_ + fVar185 * auVar124._0_4_ + fVar202 * auVar281._0_4_;
  local_6f0._4_4_ = fVar151 * auVar178._4_4_ + fVar199 * auVar124._4_4_ + fVar229 * auVar281._4_4_;
  fStack_6e8 = fVar183 * auVar178._8_4_ + fVar200 * auVar124._8_4_ + fVar230 * auVar281._8_4_;
  fStack_6e4 = fVar184 * auVar178._12_4_ + fVar201 * auVar124._12_4_ + fVar231 * auVar281._12_4_;
  auVar61._4_4_ = fVar301;
  auVar61._0_4_ = fVar291;
  auVar61._8_4_ = fVar302;
  auVar61._12_4_ = fVar303;
  local_390 = vsubps_avx(auVar61,auVar88);
  auVar281 = vshufps_avx(local_390,local_390,0xaa);
  auVar124 = vmovshdup_avx(local_390);
  auVar178 = vmovsldup_avx(local_390);
  fVar250 = fVar75 * auVar178._0_4_ + fVar185 * auVar124._0_4_ + fVar202 * auVar281._0_4_;
  fVar252 = fVar151 * auVar178._4_4_ + fVar199 * auVar124._4_4_ + fVar229 * auVar281._4_4_;
  local_6e0._4_4_ = fVar252;
  local_6e0._0_4_ = fVar250;
  fStack_6d8 = fVar183 * auVar178._8_4_ + fVar200 * auVar124._8_4_ + fVar230 * auVar281._8_4_;
  fStack_6d4 = fVar184 * auVar178._12_4_ + fVar201 * auVar124._12_4_ + fVar231 * auVar281._12_4_;
  local_3a0 = vsubps_avx(_local_4e0,auVar88);
  auVar281 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar124 = vmovshdup_avx(local_3a0);
  auVar178 = vmovsldup_avx(local_3a0);
  auVar194._0_4_ = fVar75 * auVar178._0_4_ + fVar185 * auVar124._0_4_ + fVar202 * auVar281._0_4_;
  auVar194._4_4_ = fVar151 * auVar178._4_4_ + fVar199 * auVar124._4_4_ + fVar229 * auVar281._4_4_;
  auVar194._8_4_ = fVar183 * auVar178._8_4_ + fVar200 * auVar124._8_4_ + fVar230 * auVar281._8_4_;
  auVar194._12_4_ =
       fVar184 * auVar178._12_4_ + fVar201 * auVar124._12_4_ + fVar231 * auVar281._12_4_;
  local_3b0 = vsubps_avx(_local_4f0,auVar88);
  auVar281 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar124 = vmovshdup_avx(local_3b0);
  auVar178 = vmovsldup_avx(local_3b0);
  auVar127._0_4_ = auVar178._0_4_ * fVar75 + auVar124._0_4_ * fVar185 + fVar202 * auVar281._0_4_;
  auVar127._4_4_ = auVar178._4_4_ * fVar151 + auVar124._4_4_ * fVar199 + fVar229 * auVar281._4_4_;
  auVar127._8_4_ = auVar178._8_4_ * fVar183 + auVar124._8_4_ * fVar200 + fVar230 * auVar281._8_4_;
  auVar127._12_4_ =
       auVar178._12_4_ * fVar184 + auVar124._12_4_ * fVar201 + fVar231 * auVar281._12_4_;
  local_3c0 = vsubps_avx(_local_500,auVar88);
  auVar281 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar124 = vmovshdup_avx(local_3c0);
  auVar178 = vmovsldup_avx(local_3c0);
  auVar285._0_4_ = auVar178._0_4_ * fVar75 + auVar124._0_4_ * fVar185 + auVar281._0_4_ * fVar202;
  auVar285._4_4_ = auVar178._4_4_ * fVar151 + auVar124._4_4_ * fVar199 + auVar281._4_4_ * fVar229;
  auVar285._8_4_ = auVar178._8_4_ * fVar183 + auVar124._8_4_ * fVar200 + auVar281._8_4_ * fVar230;
  auVar285._12_4_ =
       auVar178._12_4_ * fVar184 + auVar124._12_4_ * fVar201 + auVar281._12_4_ * fVar231;
  local_3d0 = vsubps_avx(_local_510,auVar88);
  auVar281 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar124 = vmovshdup_avx(local_3d0);
  auVar178 = vmovsldup_avx(local_3d0);
  auVar293._0_4_ = auVar178._0_4_ * fVar75 + auVar124._0_4_ * fVar185 + auVar281._0_4_ * fVar202;
  auVar293._4_4_ = auVar178._4_4_ * fVar151 + auVar124._4_4_ * fVar199 + auVar281._4_4_ * fVar229;
  auVar293._8_4_ = auVar178._8_4_ * fVar183 + auVar124._8_4_ * fVar200 + auVar281._8_4_ * fVar230;
  auVar293._12_4_ =
       auVar178._12_4_ * fVar184 + auVar124._12_4_ * fVar201 + auVar281._12_4_ * fVar231;
  local_3e0 = vsubps_avx(_local_420,auVar88);
  auVar281 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar124 = vmovshdup_avx(local_3e0);
  auVar178 = vmovsldup_avx(local_3e0);
  auVar307._0_4_ = auVar178._0_4_ * fVar75 + auVar124._0_4_ * fVar185 + auVar281._0_4_ * fVar202;
  auVar307._4_4_ = auVar178._4_4_ * fVar151 + auVar124._4_4_ * fVar199 + auVar281._4_4_ * fVar229;
  auVar307._8_4_ = auVar178._8_4_ * fVar183 + auVar124._8_4_ * fVar200 + auVar281._8_4_ * fVar230;
  auVar307._12_4_ =
       auVar178._12_4_ * fVar184 + auVar124._12_4_ * fVar201 + auVar281._12_4_ * fVar231;
  auVar59._4_4_ = fVar251;
  auVar59._0_4_ = fVar233;
  auVar59._8_4_ = fVar232;
  auVar59._12_4_ = fVar74;
  local_3f0 = vsubps_avx(auVar59,auVar88);
  auVar178 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar88 = vmovshdup_avx(local_3f0);
  auVar124 = vmovsldup_avx(local_3f0);
  auVar90._0_4_ = fVar75 * auVar124._0_4_ + fVar185 * auVar88._0_4_ + fVar202 * auVar178._0_4_;
  auVar90._4_4_ = fVar151 * auVar124._4_4_ + fVar199 * auVar88._4_4_ + fVar229 * auVar178._4_4_;
  auVar90._8_4_ = fVar183 * auVar124._8_4_ + fVar200 * auVar88._8_4_ + fVar230 * auVar178._8_4_;
  auVar90._12_4_ = fVar184 * auVar124._12_4_ + fVar201 * auVar88._12_4_ + fVar231 * auVar178._12_4_;
  auVar281 = vmovlhps_avx(_local_6f0,auVar285);
  auVar18 = vmovlhps_avx(_local_6e0,auVar293);
  auVar19 = vmovlhps_avx(auVar194,auVar307);
  _local_4b0 = vmovlhps_avx(auVar127,auVar90);
  auVar88 = vminps_avx(auVar281,auVar18);
  auVar124 = vminps_avx(auVar19,_local_4b0);
  auVar178 = vminps_avx(auVar88,auVar124);
  auVar88 = vmaxps_avx(auVar281,auVar18);
  auVar124 = vmaxps_avx(auVar19,_local_4b0);
  auVar88 = vmaxps_avx(auVar88,auVar124);
  auVar124 = vshufpd_avx(auVar178,auVar178,3);
  auVar178 = vminps_avx(auVar178,auVar124);
  auVar124 = vshufpd_avx(auVar88,auVar88,3);
  auVar124 = vmaxps_avx(auVar88,auVar124);
  auVar257._8_4_ = 0x7fffffff;
  auVar257._0_8_ = 0x7fffffff7fffffff;
  auVar257._12_4_ = 0x7fffffff;
  auVar88 = vandps_avx(auVar178,auVar257);
  auVar124 = vandps_avx(auVar124,auVar257);
  auVar88 = vmaxps_avx(auVar88,auVar124);
  auVar124 = vmovshdup_avx(auVar88);
  auVar88 = vmaxss_avx(auVar124,auVar88);
  local_548 = uVar63 + 0xf;
  fVar75 = auVar88._0_4_ * 9.536743e-07;
  local_4c0 = ZEXT416((uint)fVar75);
  auVar88 = vshufps_avx(local_4c0,ZEXT416((uint)fVar75),0);
  local_1c0._16_16_ = auVar88;
  local_1c0._0_16_ = auVar88;
  auVar91._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
  auVar91._8_4_ = auVar88._8_4_ ^ 0x80000000;
  auVar91._12_4_ = auVar88._12_4_ ^ 0x80000000;
  local_340._16_16_ = auVar91;
  local_340._0_16_ = auVar91;
  auVar88 = vpshufd_avx(ZEXT416(uVar67),0);
  local_2e0._16_16_ = auVar88;
  local_2e0._0_16_ = auVar88;
  auVar88 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar69 * 4 + 6)),0);
  local_300._16_16_ = auVar88;
  local_300._0_16_ = auVar88;
  bVar73 = false;
  uVar72 = 0;
  fVar75 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar18,auVar281);
  _local_360 = vsubps_avx(auVar19,auVar18);
  _local_370 = vsubps_avx(_local_4b0,auVar19);
  _local_430 = vsubps_avx(_local_500,_local_4d0);
  auVar62._4_4_ = fVar301;
  auVar62._0_4_ = fVar291;
  auVar62._8_4_ = fVar302;
  auVar62._12_4_ = fVar303;
  _local_440 = vsubps_avx(_local_510,auVar62);
  _local_450 = vsubps_avx(_local_420,_local_4e0);
  auVar60._4_4_ = fVar251;
  auVar60._0_4_ = fVar233;
  auVar60._8_4_ = fVar232;
  auVar60._12_4_ = fVar74;
  _local_460 = vsubps_avx(auVar60,_local_4f0);
  auVar92 = ZEXT816(0x3f80000000000000);
  local_400 = auVar92;
LAB_00f2d90d:
  do {
    auVar88 = vshufps_avx(auVar92,auVar92,0x50);
    auVar349._8_4_ = 0x3f800000;
    auVar349._0_8_ = 0x3f8000003f800000;
    auVar349._12_4_ = 0x3f800000;
    auVar353._16_4_ = 0x3f800000;
    auVar353._0_16_ = auVar349;
    auVar353._20_4_ = 0x3f800000;
    auVar353._24_4_ = 0x3f800000;
    auVar353._28_4_ = 0x3f800000;
    auVar124 = vsubps_avx(auVar349,auVar88);
    fVar151 = auVar88._0_4_;
    fVar183 = auVar88._4_4_;
    fVar184 = auVar88._8_4_;
    fVar185 = auVar88._12_4_;
    fVar199 = auVar124._0_4_;
    fVar200 = auVar124._4_4_;
    fVar201 = auVar124._8_4_;
    fVar202 = auVar124._12_4_;
    auVar195._0_4_ = auVar285._0_4_ * fVar151 + fVar199 * (float)local_6f0._0_4_;
    auVar195._4_4_ = auVar285._4_4_ * fVar183 + fVar200 * (float)local_6f0._4_4_;
    auVar195._8_4_ = auVar285._0_4_ * fVar184 + fVar201 * (float)local_6f0._0_4_;
    auVar195._12_4_ = auVar285._4_4_ * fVar185 + fVar202 * (float)local_6f0._4_4_;
    auVar164._0_4_ = auVar293._0_4_ * fVar151 + fVar199 * fVar250;
    auVar164._4_4_ = auVar293._4_4_ * fVar183 + fVar200 * fVar252;
    auVar164._8_4_ = auVar293._0_4_ * fVar184 + fVar201 * fVar250;
    auVar164._12_4_ = auVar293._4_4_ * fVar185 + fVar202 * fVar252;
    auVar270._0_4_ = auVar307._0_4_ * fVar151 + auVar194._0_4_ * fVar199;
    auVar270._4_4_ = auVar307._4_4_ * fVar183 + auVar194._4_4_ * fVar200;
    auVar270._8_4_ = auVar307._0_4_ * fVar184 + auVar194._0_4_ * fVar201;
    auVar270._12_4_ = auVar307._4_4_ * fVar185 + auVar194._4_4_ * fVar202;
    auVar215._0_4_ = auVar90._0_4_ * fVar151 + auVar127._0_4_ * fVar199;
    auVar215._4_4_ = auVar90._4_4_ * fVar183 + auVar127._4_4_ * fVar200;
    auVar215._8_4_ = auVar90._0_4_ * fVar184 + auVar127._0_4_ * fVar201;
    auVar215._12_4_ = auVar90._4_4_ * fVar185 + auVar127._4_4_ * fVar202;
    auVar88 = vmovshdup_avx(local_400);
    auVar124 = vshufps_avx(local_400,local_400,0);
    auVar299._16_16_ = auVar124;
    auVar299._0_16_ = auVar124;
    auVar178 = vshufps_avx(local_400,local_400,0x55);
    auVar108._16_16_ = auVar178;
    auVar108._0_16_ = auVar178;
    auVar107 = vsubps_avx(auVar108,auVar299);
    auVar178 = vshufps_avx(auVar195,auVar195,0);
    auVar141 = vshufps_avx(auVar195,auVar195,0x55);
    auVar130 = vshufps_avx(auVar164,auVar164,0);
    auVar168 = vshufps_avx(auVar164,auVar164,0x55);
    auVar131 = vshufps_avx(auVar270,auVar270,0);
    auVar262 = vshufps_avx(auVar270,auVar270,0x55);
    auVar20 = vshufps_avx(auVar215,auVar215,0);
    auVar76 = vshufps_avx(auVar215,auVar215,0x55);
    auVar88 = ZEXT416((uint)((auVar88._0_4_ - local_400._0_4_) * 0.04761905));
    auVar88 = vshufps_avx(auVar88,auVar88,0);
    auVar310._0_4_ = auVar124._0_4_ + auVar107._0_4_ * 0.0;
    auVar310._4_4_ = auVar124._4_4_ + auVar107._4_4_ * 0.14285715;
    auVar310._8_4_ = auVar124._8_4_ + auVar107._8_4_ * 0.2857143;
    auVar310._12_4_ = auVar124._12_4_ + auVar107._12_4_ * 0.42857146;
    auVar310._16_4_ = auVar124._0_4_ + auVar107._16_4_ * 0.5714286;
    auVar310._20_4_ = auVar124._4_4_ + auVar107._20_4_ * 0.71428573;
    auVar310._24_4_ = auVar124._8_4_ + auVar107._24_4_ * 0.8571429;
    auVar310._28_4_ = auVar124._12_4_ + auVar107._28_4_;
    auVar21 = vsubps_avx(auVar353,auVar310);
    fVar151 = auVar130._0_4_;
    fVar184 = auVar130._4_4_;
    fVar199 = auVar130._8_4_;
    fVar201 = auVar130._12_4_;
    fVar322 = auVar21._0_4_;
    fVar324 = auVar21._4_4_;
    fVar354 = auVar21._8_4_;
    fVar356 = auVar21._12_4_;
    fVar357 = auVar21._16_4_;
    fVar359 = auVar21._20_4_;
    fVar304 = auVar21._24_4_;
    fVar331 = auVar168._0_4_;
    fVar337 = auVar168._4_4_;
    fVar343 = auVar168._8_4_;
    fVar312 = auVar168._12_4_;
    fVar345 = auVar141._12_4_ + 1.0;
    fVar321 = auVar131._0_4_;
    fVar323 = auVar131._4_4_;
    fVar325 = auVar131._8_4_;
    fVar330 = auVar131._12_4_;
    fVar229 = fVar321 * auVar310._0_4_ + fVar322 * fVar151;
    fVar230 = fVar323 * auVar310._4_4_ + fVar324 * fVar184;
    fVar231 = fVar325 * auVar310._8_4_ + fVar354 * fVar199;
    fVar114 = fVar330 * auVar310._12_4_ + fVar356 * fVar201;
    fVar115 = fVar321 * auVar310._16_4_ + fVar357 * fVar151;
    fVar116 = fVar323 * auVar310._20_4_ + fVar359 * fVar184;
    fVar311 = fVar325 * auVar310._24_4_ + fVar304 * fVar199;
    fVar183 = auVar262._0_4_;
    fVar185 = auVar262._4_4_;
    fVar200 = auVar262._8_4_;
    fVar202 = auVar262._12_4_;
    fVar332 = fVar331 * fVar322 + auVar310._0_4_ * fVar183;
    fVar342 = fVar337 * fVar324 + auVar310._4_4_ * fVar185;
    fVar344 = fVar343 * fVar354 + auVar310._8_4_ * fVar200;
    fVar320 = fVar312 * fVar356 + auVar310._12_4_ * fVar202;
    fVar333 = fVar331 * fVar357 + auVar310._16_4_ * fVar183;
    fVar334 = fVar337 * fVar359 + auVar310._20_4_ * fVar185;
    fVar335 = fVar343 * fVar304 + auVar310._24_4_ * fVar200;
    fVar336 = fVar312 + fVar201;
    auVar124 = vshufps_avx(auVar195,auVar195,0xaa);
    auVar130 = vshufps_avx(auVar195,auVar195,0xff);
    fVar319 = fVar330 + 0.0;
    auVar168 = vshufps_avx(auVar164,auVar164,0xaa);
    auVar131 = vshufps_avx(auVar164,auVar164,0xff);
    auVar227._0_4_ =
         fVar322 * (auVar310._0_4_ * fVar151 + fVar322 * auVar178._0_4_) + auVar310._0_4_ * fVar229;
    auVar227._4_4_ =
         fVar324 * (auVar310._4_4_ * fVar184 + fVar324 * auVar178._4_4_) + auVar310._4_4_ * fVar230;
    auVar227._8_4_ =
         fVar354 * (auVar310._8_4_ * fVar199 + fVar354 * auVar178._8_4_) + auVar310._8_4_ * fVar231;
    auVar227._12_4_ =
         fVar356 * (auVar310._12_4_ * fVar201 + fVar356 * auVar178._12_4_) +
         auVar310._12_4_ * fVar114;
    auVar227._16_4_ =
         fVar357 * (auVar310._16_4_ * fVar151 + fVar357 * auVar178._0_4_) +
         auVar310._16_4_ * fVar115;
    auVar227._20_4_ =
         fVar359 * (auVar310._20_4_ * fVar184 + fVar359 * auVar178._4_4_) +
         auVar310._20_4_ * fVar116;
    auVar227._24_4_ =
         fVar304 * (auVar310._24_4_ * fVar199 + fVar304 * auVar178._8_4_) +
         auVar310._24_4_ * fVar311;
    auVar227._28_4_ = auVar178._12_4_ + 1.0 + fVar202;
    auVar248._0_4_ =
         fVar322 * (fVar331 * auVar310._0_4_ + auVar141._0_4_ * fVar322) + auVar310._0_4_ * fVar332;
    auVar248._4_4_ =
         fVar324 * (fVar337 * auVar310._4_4_ + auVar141._4_4_ * fVar324) + auVar310._4_4_ * fVar342;
    auVar248._8_4_ =
         fVar354 * (fVar343 * auVar310._8_4_ + auVar141._8_4_ * fVar354) + auVar310._8_4_ * fVar344;
    auVar248._12_4_ =
         fVar356 * (fVar312 * auVar310._12_4_ + auVar141._12_4_ * fVar356) +
         auVar310._12_4_ * fVar320;
    auVar248._16_4_ =
         fVar357 * (fVar331 * auVar310._16_4_ + auVar141._0_4_ * fVar357) +
         auVar310._16_4_ * fVar333;
    auVar248._20_4_ =
         fVar359 * (fVar337 * auVar310._20_4_ + auVar141._4_4_ * fVar359) +
         auVar310._20_4_ * fVar334;
    auVar248._24_4_ =
         fVar304 * (fVar343 * auVar310._24_4_ + auVar141._8_4_ * fVar304) +
         auVar310._24_4_ * fVar335;
    auVar248._28_4_ = auVar76._12_4_ + fVar202;
    auVar109._0_4_ =
         fVar322 * fVar229 + auVar310._0_4_ * (fVar321 * fVar322 + auVar20._0_4_ * auVar310._0_4_);
    auVar109._4_4_ =
         fVar324 * fVar230 + auVar310._4_4_ * (fVar323 * fVar324 + auVar20._4_4_ * auVar310._4_4_);
    auVar109._8_4_ =
         fVar354 * fVar231 + auVar310._8_4_ * (fVar325 * fVar354 + auVar20._8_4_ * auVar310._8_4_);
    auVar109._12_4_ =
         fVar356 * fVar114 +
         auVar310._12_4_ * (fVar330 * fVar356 + auVar20._12_4_ * auVar310._12_4_);
    auVar109._16_4_ =
         fVar357 * fVar115 + auVar310._16_4_ * (fVar321 * fVar357 + auVar20._0_4_ * auVar310._16_4_)
    ;
    auVar109._20_4_ =
         fVar359 * fVar116 + auVar310._20_4_ * (fVar323 * fVar359 + auVar20._4_4_ * auVar310._20_4_)
    ;
    auVar109._24_4_ =
         fVar304 * fVar311 + auVar310._24_4_ * (fVar325 * fVar304 + auVar20._8_4_ * auVar310._24_4_)
    ;
    auVar109._28_4_ = fVar201 + 1.0 + fVar319;
    auVar318._0_4_ =
         fVar322 * fVar332 + auVar310._0_4_ * (auVar76._0_4_ * auVar310._0_4_ + fVar322 * fVar183);
    auVar318._4_4_ =
         fVar324 * fVar342 + auVar310._4_4_ * (auVar76._4_4_ * auVar310._4_4_ + fVar324 * fVar185);
    auVar318._8_4_ =
         fVar354 * fVar344 + auVar310._8_4_ * (auVar76._8_4_ * auVar310._8_4_ + fVar354 * fVar200);
    auVar318._12_4_ =
         fVar356 * fVar320 +
         auVar310._12_4_ * (auVar76._12_4_ * auVar310._12_4_ + fVar356 * fVar202);
    auVar318._16_4_ =
         fVar357 * fVar333 + auVar310._16_4_ * (auVar76._0_4_ * auVar310._16_4_ + fVar357 * fVar183)
    ;
    auVar318._20_4_ =
         fVar359 * fVar334 + auVar310._20_4_ * (auVar76._4_4_ * auVar310._20_4_ + fVar359 * fVar185)
    ;
    auVar318._24_4_ =
         fVar304 * fVar335 + auVar310._24_4_ * (auVar76._8_4_ * auVar310._24_4_ + fVar304 * fVar200)
    ;
    auVar318._28_4_ = fVar319 + fVar202 + 0.0;
    local_200._0_4_ = fVar322 * auVar227._0_4_ + auVar310._0_4_ * auVar109._0_4_;
    local_200._4_4_ = fVar324 * auVar227._4_4_ + auVar310._4_4_ * auVar109._4_4_;
    local_200._8_4_ = fVar354 * auVar227._8_4_ + auVar310._8_4_ * auVar109._8_4_;
    local_200._12_4_ = fVar356 * auVar227._12_4_ + auVar310._12_4_ * auVar109._12_4_;
    local_200._16_4_ = fVar357 * auVar227._16_4_ + auVar310._16_4_ * auVar109._16_4_;
    local_200._20_4_ = fVar359 * auVar227._20_4_ + auVar310._20_4_ * auVar109._20_4_;
    local_200._24_4_ = fVar304 * auVar227._24_4_ + auVar310._24_4_ * auVar109._24_4_;
    local_200._28_4_ = fVar336 + fVar202 + 0.0;
    auVar198._0_4_ = fVar322 * auVar248._0_4_ + auVar310._0_4_ * auVar318._0_4_;
    auVar198._4_4_ = fVar324 * auVar248._4_4_ + auVar310._4_4_ * auVar318._4_4_;
    auVar198._8_4_ = fVar354 * auVar248._8_4_ + auVar310._8_4_ * auVar318._8_4_;
    auVar198._12_4_ = fVar356 * auVar248._12_4_ + auVar310._12_4_ * auVar318._12_4_;
    auVar198._16_4_ = fVar357 * auVar248._16_4_ + auVar310._16_4_ * auVar318._16_4_;
    auVar198._20_4_ = fVar359 * auVar248._20_4_ + auVar310._20_4_ * auVar318._20_4_;
    auVar198._24_4_ = fVar304 * auVar248._24_4_ + auVar310._24_4_ * auVar318._24_4_;
    auVar198._28_4_ = fVar336 + fVar319;
    auVar22 = vsubps_avx(auVar109,auVar227);
    auVar107 = vsubps_avx(auVar318,auVar248);
    local_620 = auVar88._0_4_;
    fStack_61c = auVar88._4_4_;
    fStack_618 = auVar88._8_4_;
    fStack_614 = auVar88._12_4_;
    local_240 = local_620 * auVar22._0_4_ * 3.0;
    fStack_23c = fStack_61c * auVar22._4_4_ * 3.0;
    auVar23._4_4_ = fStack_23c;
    auVar23._0_4_ = local_240;
    fStack_238 = fStack_618 * auVar22._8_4_ * 3.0;
    auVar23._8_4_ = fStack_238;
    fStack_234 = fStack_614 * auVar22._12_4_ * 3.0;
    auVar23._12_4_ = fStack_234;
    fStack_230 = local_620 * auVar22._16_4_ * 3.0;
    auVar23._16_4_ = fStack_230;
    fStack_22c = fStack_61c * auVar22._20_4_ * 3.0;
    auVar23._20_4_ = fStack_22c;
    fStack_228 = fStack_618 * auVar22._24_4_ * 3.0;
    auVar23._24_4_ = fStack_228;
    auVar23._28_4_ = auVar22._28_4_;
    local_260 = local_620 * auVar107._0_4_ * 3.0;
    fStack_25c = fStack_61c * auVar107._4_4_ * 3.0;
    auVar24._4_4_ = fStack_25c;
    auVar24._0_4_ = local_260;
    fStack_258 = fStack_618 * auVar107._8_4_ * 3.0;
    auVar24._8_4_ = fStack_258;
    fStack_254 = fStack_614 * auVar107._12_4_ * 3.0;
    auVar24._12_4_ = fStack_254;
    fStack_250 = local_620 * auVar107._16_4_ * 3.0;
    auVar24._16_4_ = fStack_250;
    fStack_24c = fStack_61c * auVar107._20_4_ * 3.0;
    auVar24._20_4_ = fStack_24c;
    fStack_248 = fStack_618 * auVar107._24_4_ * 3.0;
    auVar24._24_4_ = fStack_248;
    auVar24._28_4_ = fVar336;
    auVar23 = vsubps_avx(local_200,auVar23);
    auVar107 = vperm2f128_avx(auVar23,auVar23,1);
    auVar107 = vshufps_avx(auVar107,auVar23,0x30);
    auVar107 = vshufps_avx(auVar23,auVar107,0x29);
    auVar24 = vsubps_avx(auVar198,auVar24);
    auVar23 = vperm2f128_avx(auVar24,auVar24,1);
    auVar23 = vshufps_avx(auVar23,auVar24,0x30);
    auVar24 = vshufps_avx(auVar24,auVar23,0x29);
    fVar334 = auVar168._0_4_;
    fVar335 = auVar168._4_4_;
    fVar358 = auVar168._8_4_;
    fVar201 = auVar124._12_4_;
    fVar323 = auVar131._0_4_;
    fVar330 = auVar131._4_4_;
    fVar332 = auVar131._8_4_;
    fVar342 = auVar131._12_4_;
    auVar88 = vshufps_avx(auVar270,auVar270,0xaa);
    fVar151 = auVar88._0_4_;
    fVar184 = auVar88._4_4_;
    fVar199 = auVar88._8_4_;
    fVar202 = auVar88._12_4_;
    fVar231 = auVar310._0_4_ * fVar151 + fVar334 * fVar322;
    fVar114 = auVar310._4_4_ * fVar184 + fVar335 * fVar324;
    fVar115 = auVar310._8_4_ * fVar199 + fVar358 * fVar354;
    fVar116 = auVar310._12_4_ * fVar202 + auVar168._12_4_ * fVar356;
    fVar311 = auVar310._16_4_ * fVar151 + fVar334 * fVar357;
    fVar319 = auVar310._20_4_ * fVar184 + fVar335 * fVar359;
    fVar321 = auVar310._24_4_ * fVar199 + fVar358 * fVar304;
    auVar88 = vshufps_avx(auVar270,auVar270,0xff);
    fVar183 = auVar88._0_4_;
    fVar185 = auVar88._4_4_;
    fVar200 = auVar88._8_4_;
    fVar229 = auVar88._12_4_;
    fVar325 = auVar310._0_4_ * fVar183 + fVar323 * fVar322;
    fVar331 = auVar310._4_4_ * fVar185 + fVar330 * fVar324;
    fVar337 = auVar310._8_4_ * fVar200 + fVar332 * fVar354;
    fVar343 = auVar310._12_4_ * fVar229 + fVar342 * fVar356;
    fVar344 = auVar310._16_4_ * fVar183 + fVar323 * fVar357;
    fVar312 = auVar310._20_4_ * fVar185 + fVar330 * fVar359;
    fVar320 = auVar310._24_4_ * fVar200 + fVar332 * fVar304;
    auVar88 = vshufps_avx(auVar215,auVar215,0xaa);
    fVar333 = auVar88._12_4_ + fVar202;
    auVar178 = vshufps_avx(auVar215,auVar215,0xff);
    fVar230 = auVar178._12_4_;
    auVar110._0_4_ =
         fVar322 * (fVar334 * auVar310._0_4_ + fVar322 * auVar124._0_4_) + auVar310._0_4_ * fVar231;
    auVar110._4_4_ =
         fVar324 * (fVar335 * auVar310._4_4_ + fVar324 * auVar124._4_4_) + auVar310._4_4_ * fVar114;
    auVar110._8_4_ =
         fVar354 * (fVar358 * auVar310._8_4_ + fVar354 * auVar124._8_4_) + auVar310._8_4_ * fVar115;
    auVar110._12_4_ =
         fVar356 * (auVar168._12_4_ * auVar310._12_4_ + fVar356 * fVar201) +
         auVar310._12_4_ * fVar116;
    auVar110._16_4_ =
         fVar357 * (fVar334 * auVar310._16_4_ + fVar357 * auVar124._0_4_) +
         auVar310._16_4_ * fVar311;
    auVar110._20_4_ =
         fVar359 * (fVar335 * auVar310._20_4_ + fVar359 * auVar124._4_4_) +
         auVar310._20_4_ * fVar319;
    auVar110._24_4_ =
         fVar304 * (fVar358 * auVar310._24_4_ + fVar304 * auVar124._8_4_) +
         auVar310._24_4_ * fVar321;
    auVar110._28_4_ = auVar24._28_4_ + fVar201 + fVar230;
    auVar146._0_4_ =
         fVar322 * (fVar323 * auVar310._0_4_ + auVar130._0_4_ * fVar322) + auVar310._0_4_ * fVar325;
    auVar146._4_4_ =
         fVar324 * (fVar330 * auVar310._4_4_ + auVar130._4_4_ * fVar324) + auVar310._4_4_ * fVar331;
    auVar146._8_4_ =
         fVar354 * (fVar332 * auVar310._8_4_ + auVar130._8_4_ * fVar354) + auVar310._8_4_ * fVar337;
    auVar146._12_4_ =
         fVar356 * (fVar342 * auVar310._12_4_ + auVar130._12_4_ * fVar356) +
         auVar310._12_4_ * fVar343;
    auVar146._16_4_ =
         fVar357 * (fVar323 * auVar310._16_4_ + auVar130._0_4_ * fVar357) +
         auVar310._16_4_ * fVar344;
    auVar146._20_4_ =
         fVar359 * (fVar330 * auVar310._20_4_ + auVar130._4_4_ * fVar359) +
         auVar310._20_4_ * fVar312;
    auVar146._24_4_ =
         fVar304 * (fVar332 * auVar310._24_4_ + auVar130._8_4_ * fVar304) +
         auVar310._24_4_ * fVar320;
    auVar146._28_4_ = fVar201 + auVar23._28_4_ + fVar230;
    auVar23 = vperm2f128_avx(local_200,local_200,1);
    auVar23 = vshufps_avx(auVar23,local_200,0x30);
    auVar108 = vshufps_avx(local_200,auVar23,0x29);
    auVar249._0_4_ =
         auVar310._0_4_ * (auVar88._0_4_ * auVar310._0_4_ + fVar322 * fVar151) + fVar322 * fVar231;
    auVar249._4_4_ =
         auVar310._4_4_ * (auVar88._4_4_ * auVar310._4_4_ + fVar324 * fVar184) + fVar324 * fVar114;
    auVar249._8_4_ =
         auVar310._8_4_ * (auVar88._8_4_ * auVar310._8_4_ + fVar354 * fVar199) + fVar354 * fVar115;
    auVar249._12_4_ =
         auVar310._12_4_ * (auVar88._12_4_ * auVar310._12_4_ + fVar356 * fVar202) +
         fVar356 * fVar116;
    auVar249._16_4_ =
         auVar310._16_4_ * (auVar88._0_4_ * auVar310._16_4_ + fVar357 * fVar151) + fVar357 * fVar311
    ;
    auVar249._20_4_ =
         auVar310._20_4_ * (auVar88._4_4_ * auVar310._20_4_ + fVar359 * fVar184) + fVar359 * fVar319
    ;
    auVar249._24_4_ =
         auVar310._24_4_ * (auVar88._8_4_ * auVar310._24_4_ + fVar304 * fVar199) + fVar304 * fVar321
    ;
    auVar249._28_4_ = fVar333 + fVar345 + auVar248._28_4_;
    auVar290._0_4_ =
         fVar322 * fVar325 + auVar310._0_4_ * (auVar310._0_4_ * auVar178._0_4_ + fVar322 * fVar183);
    auVar290._4_4_ =
         fVar324 * fVar331 + auVar310._4_4_ * (auVar310._4_4_ * auVar178._4_4_ + fVar324 * fVar185);
    auVar290._8_4_ =
         fVar354 * fVar337 + auVar310._8_4_ * (auVar310._8_4_ * auVar178._8_4_ + fVar354 * fVar200);
    auVar290._12_4_ =
         fVar356 * fVar343 + auVar310._12_4_ * (auVar310._12_4_ * fVar230 + fVar356 * fVar229);
    auVar290._16_4_ =
         fVar357 * fVar344 +
         auVar310._16_4_ * (auVar310._16_4_ * auVar178._0_4_ + fVar357 * fVar183);
    auVar290._20_4_ =
         fVar359 * fVar312 +
         auVar310._20_4_ * (auVar310._20_4_ * auVar178._4_4_ + fVar359 * fVar185);
    auVar290._24_4_ =
         fVar304 * fVar320 +
         auVar310._24_4_ * (auVar310._24_4_ * auVar178._8_4_ + fVar304 * fVar200);
    auVar290._28_4_ = fVar345 + fVar342 + fVar230 + fVar229;
    auVar272._0_4_ = fVar322 * auVar110._0_4_ + auVar310._0_4_ * auVar249._0_4_;
    auVar272._4_4_ = fVar324 * auVar110._4_4_ + auVar310._4_4_ * auVar249._4_4_;
    auVar272._8_4_ = fVar354 * auVar110._8_4_ + auVar310._8_4_ * auVar249._8_4_;
    auVar272._12_4_ = fVar356 * auVar110._12_4_ + auVar310._12_4_ * auVar249._12_4_;
    auVar272._16_4_ = fVar357 * auVar110._16_4_ + auVar310._16_4_ * auVar249._16_4_;
    auVar272._20_4_ = fVar359 * auVar110._20_4_ + auVar310._20_4_ * auVar249._20_4_;
    auVar272._24_4_ = fVar304 * auVar110._24_4_ + auVar310._24_4_ * auVar249._24_4_;
    auVar272._28_4_ = fVar333 + fVar230 + fVar229;
    auVar300._0_4_ = fVar322 * auVar146._0_4_ + auVar310._0_4_ * auVar290._0_4_;
    auVar300._4_4_ = fVar324 * auVar146._4_4_ + auVar310._4_4_ * auVar290._4_4_;
    auVar300._8_4_ = fVar354 * auVar146._8_4_ + auVar310._8_4_ * auVar290._8_4_;
    auVar300._12_4_ = fVar356 * auVar146._12_4_ + auVar310._12_4_ * auVar290._12_4_;
    auVar300._16_4_ = fVar357 * auVar146._16_4_ + auVar310._16_4_ * auVar290._16_4_;
    auVar300._20_4_ = fVar359 * auVar146._20_4_ + auVar310._20_4_ * auVar290._20_4_;
    auVar300._24_4_ = fVar304 * auVar146._24_4_ + auVar310._24_4_ * auVar290._24_4_;
    auVar300._28_4_ = auVar21._28_4_ + auVar310._28_4_;
    auVar25 = vsubps_avx(auVar249,auVar110);
    auVar23 = vsubps_avx(auVar290,auVar146);
    local_280 = local_620 * auVar25._0_4_ * 3.0;
    fStack_27c = fStack_61c * auVar25._4_4_ * 3.0;
    auVar21._4_4_ = fStack_27c;
    auVar21._0_4_ = local_280;
    fStack_278 = fStack_618 * auVar25._8_4_ * 3.0;
    auVar21._8_4_ = fStack_278;
    fStack_274 = fStack_614 * auVar25._12_4_ * 3.0;
    auVar21._12_4_ = fStack_274;
    fStack_270 = local_620 * auVar25._16_4_ * 3.0;
    auVar21._16_4_ = fStack_270;
    fStack_26c = fStack_61c * auVar25._20_4_ * 3.0;
    auVar21._20_4_ = fStack_26c;
    fStack_268 = fStack_618 * auVar25._24_4_ * 3.0;
    auVar21._24_4_ = fStack_268;
    auVar21._28_4_ = auVar25._28_4_;
    local_2a0 = local_620 * auVar23._0_4_ * 3.0;
    fStack_29c = fStack_61c * auVar23._4_4_ * 3.0;
    auVar26._4_4_ = fStack_29c;
    auVar26._0_4_ = local_2a0;
    fStack_298 = fStack_618 * auVar23._8_4_ * 3.0;
    auVar26._8_4_ = fStack_298;
    fStack_294 = fStack_614 * auVar23._12_4_ * 3.0;
    auVar26._12_4_ = fStack_294;
    fStack_290 = local_620 * auVar23._16_4_ * 3.0;
    auVar26._16_4_ = fStack_290;
    fStack_28c = fStack_61c * auVar23._20_4_ * 3.0;
    auVar26._20_4_ = fStack_28c;
    fStack_288 = fStack_618 * auVar23._24_4_ * 3.0;
    auVar26._24_4_ = fStack_288;
    auVar26._28_4_ = auVar249._28_4_;
    auVar23 = vperm2f128_avx(auVar272,auVar272,1);
    auVar23 = vshufps_avx(auVar23,auVar272,0x30);
    auVar109 = vshufps_avx(auVar272,auVar23,0x29);
    auVar21 = vsubps_avx(auVar272,auVar21);
    auVar23 = vperm2f128_avx(auVar21,auVar21,1);
    auVar23 = vshufps_avx(auVar23,auVar21,0x30);
    auVar23 = vshufps_avx(auVar21,auVar23,0x29);
    auVar26 = vsubps_avx(auVar300,auVar26);
    auVar21 = vperm2f128_avx(auVar26,auVar26,1);
    auVar21 = vshufps_avx(auVar21,auVar26,0x30);
    auVar26 = vshufps_avx(auVar26,auVar21,0x29);
    auVar27 = vsubps_avx(auVar272,local_200);
    auVar110 = vsubps_avx(auVar109,auVar108);
    fVar151 = auVar110._0_4_ + auVar27._0_4_;
    fVar183 = auVar110._4_4_ + auVar27._4_4_;
    fVar184 = auVar110._8_4_ + auVar27._8_4_;
    fVar185 = auVar110._12_4_ + auVar27._12_4_;
    fVar199 = auVar110._16_4_ + auVar27._16_4_;
    fVar200 = auVar110._20_4_ + auVar27._20_4_;
    fVar201 = auVar110._24_4_ + auVar27._24_4_;
    auVar21 = vperm2f128_avx(auVar198,auVar198,1);
    auVar21 = vshufps_avx(auVar21,auVar198,0x30);
    local_220 = vshufps_avx(auVar198,auVar21,0x29);
    auVar21 = vperm2f128_avx(auVar300,auVar300,1);
    auVar21 = vshufps_avx(auVar21,auVar300,0x30);
    local_1e0 = vshufps_avx(auVar300,auVar21,0x29);
    auVar21 = vsubps_avx(auVar300,auVar198);
    auVar146 = vsubps_avx(local_1e0,local_220);
    fVar202 = auVar146._0_4_ + auVar21._0_4_;
    fVar229 = auVar146._4_4_ + auVar21._4_4_;
    fVar230 = auVar146._8_4_ + auVar21._8_4_;
    fVar231 = auVar146._12_4_ + auVar21._12_4_;
    fVar114 = auVar146._16_4_ + auVar21._16_4_;
    fVar115 = auVar146._20_4_ + auVar21._20_4_;
    fVar116 = auVar146._24_4_ + auVar21._24_4_;
    auVar28._4_4_ = fVar183 * auVar198._4_4_;
    auVar28._0_4_ = fVar151 * auVar198._0_4_;
    auVar28._8_4_ = fVar184 * auVar198._8_4_;
    auVar28._12_4_ = fVar185 * auVar198._12_4_;
    auVar28._16_4_ = fVar199 * auVar198._16_4_;
    auVar28._20_4_ = fVar200 * auVar198._20_4_;
    auVar28._24_4_ = fVar201 * auVar198._24_4_;
    auVar28._28_4_ = auVar21._28_4_;
    auVar29._4_4_ = fVar229 * local_200._4_4_;
    auVar29._0_4_ = fVar202 * local_200._0_4_;
    auVar29._8_4_ = fVar230 * local_200._8_4_;
    auVar29._12_4_ = fVar231 * local_200._12_4_;
    auVar29._16_4_ = fVar114 * local_200._16_4_;
    auVar29._20_4_ = fVar115 * local_200._20_4_;
    auVar29._24_4_ = fVar116 * local_200._24_4_;
    auVar29._28_4_ = fVar333;
    auVar28 = vsubps_avx(auVar28,auVar29);
    local_240 = local_200._0_4_ + local_240;
    fStack_23c = local_200._4_4_ + fStack_23c;
    fStack_238 = local_200._8_4_ + fStack_238;
    fStack_234 = local_200._12_4_ + fStack_234;
    fStack_230 = local_200._16_4_ + fStack_230;
    fStack_22c = local_200._20_4_ + fStack_22c;
    fStack_228 = local_200._24_4_ + fStack_228;
    fStack_224 = local_200._28_4_ + auVar22._28_4_;
    local_260 = local_260 + auVar198._0_4_;
    fStack_25c = fStack_25c + auVar198._4_4_;
    fStack_258 = fStack_258 + auVar198._8_4_;
    fStack_254 = fStack_254 + auVar198._12_4_;
    fStack_250 = fStack_250 + auVar198._16_4_;
    fStack_24c = fStack_24c + auVar198._20_4_;
    fStack_248 = fStack_248 + auVar198._24_4_;
    fStack_244 = fVar336 + auVar198._28_4_;
    auVar22._4_4_ = fVar183 * fStack_25c;
    auVar22._0_4_ = fVar151 * local_260;
    auVar22._8_4_ = fVar184 * fStack_258;
    auVar22._12_4_ = fVar185 * fStack_254;
    auVar22._16_4_ = fVar199 * fStack_250;
    auVar22._20_4_ = fVar200 * fStack_24c;
    auVar22._24_4_ = fVar201 * fStack_248;
    auVar22._28_4_ = fVar336;
    auVar30._4_4_ = fVar229 * fStack_23c;
    auVar30._0_4_ = fVar202 * local_240;
    auVar30._8_4_ = fVar230 * fStack_238;
    auVar30._12_4_ = fVar231 * fStack_234;
    auVar30._16_4_ = fVar114 * fStack_230;
    auVar30._20_4_ = fVar115 * fStack_22c;
    auVar30._24_4_ = fVar116 * fStack_228;
    auVar30._28_4_ = fVar336 + auVar198._28_4_;
    auVar22 = vsubps_avx(auVar22,auVar30);
    local_680 = auVar24._0_4_;
    fStack_67c = auVar24._4_4_;
    fStack_678 = auVar24._8_4_;
    fStack_674 = auVar24._12_4_;
    fStack_670 = auVar24._16_4_;
    fStack_66c = auVar24._20_4_;
    fStack_668 = auVar24._24_4_;
    auVar31._4_4_ = fVar183 * fStack_67c;
    auVar31._0_4_ = fVar151 * local_680;
    auVar31._8_4_ = fVar184 * fStack_678;
    auVar31._12_4_ = fVar185 * fStack_674;
    auVar31._16_4_ = fVar199 * fStack_670;
    auVar31._20_4_ = fVar200 * fStack_66c;
    auVar31._24_4_ = fVar201 * fStack_668;
    auVar31._28_4_ = fVar336;
    local_6e0._0_4_ = auVar107._0_4_;
    local_6e0._4_4_ = auVar107._4_4_;
    fStack_6d8 = auVar107._8_4_;
    fStack_6d4 = auVar107._12_4_;
    fStack_6d0 = auVar107._16_4_;
    fStack_6cc = auVar107._20_4_;
    fStack_6c8 = auVar107._24_4_;
    auVar32._4_4_ = fVar229 * (float)local_6e0._4_4_;
    auVar32._0_4_ = fVar202 * (float)local_6e0._0_4_;
    auVar32._8_4_ = fVar230 * fStack_6d8;
    auVar32._12_4_ = fVar231 * fStack_6d4;
    auVar32._16_4_ = fVar114 * fStack_6d0;
    auVar32._20_4_ = fVar115 * fStack_6cc;
    auVar32._24_4_ = fVar116 * fStack_6c8;
    auVar32._28_4_ = local_200._28_4_;
    auVar29 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = local_220._4_4_ * fVar183;
    auVar33._0_4_ = local_220._0_4_ * fVar151;
    auVar33._8_4_ = local_220._8_4_ * fVar184;
    auVar33._12_4_ = local_220._12_4_ * fVar185;
    auVar33._16_4_ = local_220._16_4_ * fVar199;
    auVar33._20_4_ = local_220._20_4_ * fVar200;
    auVar33._24_4_ = local_220._24_4_ * fVar201;
    auVar33._28_4_ = fVar336;
    auVar34._4_4_ = auVar108._4_4_ * fVar229;
    auVar34._0_4_ = auVar108._0_4_ * fVar202;
    auVar34._8_4_ = auVar108._8_4_ * fVar230;
    auVar34._12_4_ = auVar108._12_4_ * fVar231;
    auVar34._16_4_ = auVar108._16_4_ * fVar114;
    auVar34._20_4_ = auVar108._20_4_ * fVar115;
    auVar34._24_4_ = auVar108._24_4_ * fVar116;
    auVar34._28_4_ = local_220._28_4_;
    local_620 = auVar23._0_4_;
    fStack_61c = auVar23._4_4_;
    fStack_618 = auVar23._8_4_;
    fStack_614 = auVar23._12_4_;
    fStack_610 = auVar23._16_4_;
    fStack_60c = auVar23._20_4_;
    fStack_608 = auVar23._24_4_;
    auVar30 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar300._4_4_ * fVar183;
    auVar35._0_4_ = auVar300._0_4_ * fVar151;
    auVar35._8_4_ = auVar300._8_4_ * fVar184;
    auVar35._12_4_ = auVar300._12_4_ * fVar185;
    auVar35._16_4_ = auVar300._16_4_ * fVar199;
    auVar35._20_4_ = auVar300._20_4_ * fVar200;
    auVar35._24_4_ = auVar300._24_4_ * fVar201;
    auVar35._28_4_ = fVar336;
    auVar36._4_4_ = fVar229 * auVar272._4_4_;
    auVar36._0_4_ = fVar202 * auVar272._0_4_;
    auVar36._8_4_ = fVar230 * auVar272._8_4_;
    auVar36._12_4_ = fVar231 * auVar272._12_4_;
    auVar36._16_4_ = fVar114 * auVar272._16_4_;
    auVar36._20_4_ = fVar115 * auVar272._20_4_;
    auVar36._24_4_ = fVar116 * auVar272._24_4_;
    auVar36._28_4_ = fStack_224;
    auVar31 = vsubps_avx(auVar35,auVar36);
    local_280 = auVar272._0_4_ + local_280;
    fStack_27c = auVar272._4_4_ + fStack_27c;
    fStack_278 = auVar272._8_4_ + fStack_278;
    fStack_274 = auVar272._12_4_ + fStack_274;
    fStack_270 = auVar272._16_4_ + fStack_270;
    fStack_26c = auVar272._20_4_ + fStack_26c;
    fStack_268 = auVar272._24_4_ + fStack_268;
    fStack_264 = auVar272._28_4_ + auVar25._28_4_;
    local_2a0 = auVar300._0_4_ + local_2a0;
    fStack_29c = auVar300._4_4_ + fStack_29c;
    fStack_298 = auVar300._8_4_ + fStack_298;
    fStack_294 = auVar300._12_4_ + fStack_294;
    fStack_290 = auVar300._16_4_ + fStack_290;
    fStack_28c = auVar300._20_4_ + fStack_28c;
    fStack_288 = auVar300._24_4_ + fStack_288;
    fStack_284 = auVar300._28_4_ + auVar249._28_4_;
    auVar25._4_4_ = fVar183 * fStack_29c;
    auVar25._0_4_ = fVar151 * local_2a0;
    auVar25._8_4_ = fVar184 * fStack_298;
    auVar25._12_4_ = fVar185 * fStack_294;
    auVar25._16_4_ = fVar199 * fStack_290;
    auVar25._20_4_ = fVar200 * fStack_28c;
    auVar25._24_4_ = fVar201 * fStack_288;
    auVar25._28_4_ = auVar300._28_4_ + auVar249._28_4_;
    auVar37._4_4_ = fStack_27c * fVar229;
    auVar37._0_4_ = local_280 * fVar202;
    auVar37._8_4_ = fStack_278 * fVar230;
    auVar37._12_4_ = fStack_274 * fVar231;
    auVar37._16_4_ = fStack_270 * fVar114;
    auVar37._20_4_ = fStack_26c * fVar115;
    auVar37._24_4_ = fStack_268 * fVar116;
    auVar37._28_4_ = fStack_264;
    auVar25 = vsubps_avx(auVar25,auVar37);
    auVar38._4_4_ = fVar183 * auVar26._4_4_;
    auVar38._0_4_ = fVar151 * auVar26._0_4_;
    auVar38._8_4_ = fVar184 * auVar26._8_4_;
    auVar38._12_4_ = fVar185 * auVar26._12_4_;
    auVar38._16_4_ = fVar199 * auVar26._16_4_;
    auVar38._20_4_ = fVar200 * auVar26._20_4_;
    auVar38._24_4_ = fVar201 * auVar26._24_4_;
    auVar38._28_4_ = fStack_264;
    auVar39._4_4_ = fVar229 * fStack_61c;
    auVar39._0_4_ = fVar202 * local_620;
    auVar39._8_4_ = fVar230 * fStack_618;
    auVar39._12_4_ = fVar231 * fStack_614;
    auVar39._16_4_ = fVar114 * fStack_610;
    auVar39._20_4_ = fVar115 * fStack_60c;
    auVar39._24_4_ = fVar116 * fStack_608;
    auVar39._28_4_ = auVar26._28_4_;
    auVar32 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = fVar183 * local_1e0._4_4_;
    auVar40._0_4_ = fVar151 * local_1e0._0_4_;
    auVar40._8_4_ = fVar184 * local_1e0._8_4_;
    auVar40._12_4_ = fVar185 * local_1e0._12_4_;
    auVar40._16_4_ = fVar199 * local_1e0._16_4_;
    auVar40._20_4_ = fVar200 * local_1e0._20_4_;
    auVar40._24_4_ = fVar201 * local_1e0._24_4_;
    auVar40._28_4_ = auVar110._28_4_ + auVar27._28_4_;
    auVar27._4_4_ = auVar109._4_4_ * fVar229;
    auVar27._0_4_ = auVar109._0_4_ * fVar202;
    auVar27._8_4_ = auVar109._8_4_ * fVar230;
    auVar27._12_4_ = auVar109._12_4_ * fVar231;
    auVar27._16_4_ = auVar109._16_4_ * fVar114;
    auVar27._20_4_ = auVar109._20_4_ * fVar115;
    auVar27._24_4_ = auVar109._24_4_ * fVar116;
    auVar27._28_4_ = auVar146._28_4_ + auVar21._28_4_;
    auVar27 = vsubps_avx(auVar40,auVar27);
    auVar23 = vminps_avx(auVar28,auVar22);
    auVar107 = vmaxps_avx(auVar28,auVar22);
    auVar24 = vminps_avx(auVar29,auVar30);
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar29,auVar30);
    auVar107 = vmaxps_avx(auVar107,auVar23);
    auVar21 = vminps_avx(auVar31,auVar25);
    auVar23 = vmaxps_avx(auVar31,auVar25);
    auVar22 = vminps_avx(auVar32,auVar27);
    auVar22 = vminps_avx(auVar21,auVar22);
    auVar22 = vminps_avx(auVar24,auVar22);
    auVar24 = vmaxps_avx(auVar32,auVar27);
    auVar23 = vmaxps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar107,auVar23);
    auVar107 = vcmpps_avx(auVar22,local_1c0,2);
    auVar23 = vcmpps_avx(auVar23,local_340,5);
    auVar107 = vandps_avx(auVar23,auVar107);
    auVar23 = local_2c0 & auVar107;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar23 = vsubps_avx(auVar108,local_200);
      auVar24 = vsubps_avx(auVar109,auVar272);
      fVar183 = auVar23._0_4_ + auVar24._0_4_;
      fVar184 = auVar23._4_4_ + auVar24._4_4_;
      fVar185 = auVar23._8_4_ + auVar24._8_4_;
      fVar199 = auVar23._12_4_ + auVar24._12_4_;
      fVar200 = auVar23._16_4_ + auVar24._16_4_;
      fVar201 = auVar23._20_4_ + auVar24._20_4_;
      fVar202 = auVar23._24_4_ + auVar24._24_4_;
      auVar22 = vsubps_avx(local_220,auVar198);
      auVar25 = vsubps_avx(local_1e0,auVar300);
      fVar229 = auVar22._0_4_ + auVar25._0_4_;
      fVar230 = auVar22._4_4_ + auVar25._4_4_;
      fVar231 = auVar22._8_4_ + auVar25._8_4_;
      fVar114 = auVar22._12_4_ + auVar25._12_4_;
      fVar115 = auVar22._16_4_ + auVar25._16_4_;
      fVar116 = auVar22._20_4_ + auVar25._20_4_;
      fVar311 = auVar22._24_4_ + auVar25._24_4_;
      fVar151 = auVar25._28_4_;
      auVar41._4_4_ = auVar198._4_4_ * fVar184;
      auVar41._0_4_ = auVar198._0_4_ * fVar183;
      auVar41._8_4_ = auVar198._8_4_ * fVar185;
      auVar41._12_4_ = auVar198._12_4_ * fVar199;
      auVar41._16_4_ = auVar198._16_4_ * fVar200;
      auVar41._20_4_ = auVar198._20_4_ * fVar201;
      auVar41._24_4_ = auVar198._24_4_ * fVar202;
      auVar41._28_4_ = auVar198._28_4_;
      auVar42._4_4_ = local_200._4_4_ * fVar230;
      auVar42._0_4_ = local_200._0_4_ * fVar229;
      auVar42._8_4_ = local_200._8_4_ * fVar231;
      auVar42._12_4_ = local_200._12_4_ * fVar114;
      auVar42._16_4_ = local_200._16_4_ * fVar115;
      auVar42._20_4_ = local_200._20_4_ * fVar116;
      auVar42._24_4_ = local_200._24_4_ * fVar311;
      auVar42._28_4_ = local_200._28_4_;
      auVar25 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar184 * fStack_25c;
      auVar43._0_4_ = fVar183 * local_260;
      auVar43._8_4_ = fVar185 * fStack_258;
      auVar43._12_4_ = fVar199 * fStack_254;
      auVar43._16_4_ = fVar200 * fStack_250;
      auVar43._20_4_ = fVar201 * fStack_24c;
      auVar43._24_4_ = fVar202 * fStack_248;
      auVar43._28_4_ = auVar198._28_4_;
      auVar44._4_4_ = fVar230 * fStack_23c;
      auVar44._0_4_ = fVar229 * local_240;
      auVar44._8_4_ = fVar231 * fStack_238;
      auVar44._12_4_ = fVar114 * fStack_234;
      auVar44._16_4_ = fVar115 * fStack_230;
      auVar44._20_4_ = fVar116 * fStack_22c;
      auVar44._24_4_ = fVar311 * fStack_228;
      auVar44._28_4_ = fVar151;
      auVar27 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar184 * fStack_67c;
      auVar45._0_4_ = fVar183 * local_680;
      auVar45._8_4_ = fVar185 * fStack_678;
      auVar45._12_4_ = fVar199 * fStack_674;
      auVar45._16_4_ = fVar200 * fStack_670;
      auVar45._20_4_ = fVar201 * fStack_66c;
      auVar45._24_4_ = fVar202 * fStack_668;
      auVar45._28_4_ = fVar151;
      auVar46._4_4_ = fVar230 * (float)local_6e0._4_4_;
      auVar46._0_4_ = fVar229 * (float)local_6e0._0_4_;
      auVar46._8_4_ = fVar231 * fStack_6d8;
      auVar46._12_4_ = fVar114 * fStack_6d4;
      auVar46._16_4_ = fVar115 * fStack_6d0;
      auVar46._20_4_ = fVar116 * fStack_6cc;
      auVar46._24_4_ = fVar311 * fStack_6c8;
      auVar46._28_4_ = auVar21._28_4_;
      auVar110 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = local_220._4_4_ * fVar184;
      auVar47._0_4_ = local_220._0_4_ * fVar183;
      auVar47._8_4_ = local_220._8_4_ * fVar185;
      auVar47._12_4_ = local_220._12_4_ * fVar199;
      auVar47._16_4_ = local_220._16_4_ * fVar200;
      auVar47._20_4_ = local_220._20_4_ * fVar201;
      auVar47._24_4_ = local_220._24_4_ * fVar202;
      auVar47._28_4_ = auVar21._28_4_;
      auVar48._4_4_ = auVar108._4_4_ * fVar230;
      auVar48._0_4_ = auVar108._0_4_ * fVar229;
      auVar48._8_4_ = auVar108._8_4_ * fVar231;
      auVar48._12_4_ = auVar108._12_4_ * fVar114;
      auVar48._16_4_ = auVar108._16_4_ * fVar115;
      auVar48._20_4_ = auVar108._20_4_ * fVar116;
      uVar9 = auVar108._28_4_;
      auVar48._24_4_ = auVar108._24_4_ * fVar311;
      auVar48._28_4_ = uVar9;
      auVar108 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = auVar300._4_4_ * fVar184;
      auVar49._0_4_ = auVar300._0_4_ * fVar183;
      auVar49._8_4_ = auVar300._8_4_ * fVar185;
      auVar49._12_4_ = auVar300._12_4_ * fVar199;
      auVar49._16_4_ = auVar300._16_4_ * fVar200;
      auVar49._20_4_ = auVar300._20_4_ * fVar201;
      auVar49._24_4_ = auVar300._24_4_ * fVar202;
      auVar49._28_4_ = uVar9;
      auVar50._4_4_ = auVar272._4_4_ * fVar230;
      auVar50._0_4_ = auVar272._0_4_ * fVar229;
      auVar50._8_4_ = auVar272._8_4_ * fVar231;
      auVar50._12_4_ = auVar272._12_4_ * fVar114;
      auVar50._16_4_ = auVar272._16_4_ * fVar115;
      auVar50._20_4_ = auVar272._20_4_ * fVar116;
      auVar50._24_4_ = auVar272._24_4_ * fVar311;
      auVar50._28_4_ = auVar272._28_4_;
      auVar146 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar184 * fStack_29c;
      auVar51._0_4_ = fVar183 * local_2a0;
      auVar51._8_4_ = fVar185 * fStack_298;
      auVar51._12_4_ = fVar199 * fStack_294;
      auVar51._16_4_ = fVar200 * fStack_290;
      auVar51._20_4_ = fVar201 * fStack_28c;
      auVar51._24_4_ = fVar202 * fStack_288;
      auVar51._28_4_ = uVar9;
      auVar52._4_4_ = fVar230 * fStack_27c;
      auVar52._0_4_ = fVar229 * local_280;
      auVar52._8_4_ = fVar231 * fStack_278;
      auVar52._12_4_ = fVar114 * fStack_274;
      auVar52._16_4_ = fVar115 * fStack_270;
      auVar52._20_4_ = fVar116 * fStack_26c;
      auVar52._24_4_ = fVar311 * fStack_268;
      auVar52._28_4_ = auVar300._28_4_;
      auVar28 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar184 * auVar26._4_4_;
      auVar53._0_4_ = fVar183 * auVar26._0_4_;
      auVar53._8_4_ = fVar185 * auVar26._8_4_;
      auVar53._12_4_ = fVar199 * auVar26._12_4_;
      auVar53._16_4_ = fVar200 * auVar26._16_4_;
      auVar53._20_4_ = fVar201 * auVar26._20_4_;
      auVar53._24_4_ = fVar202 * auVar26._24_4_;
      auVar53._28_4_ = auVar300._28_4_;
      auVar54._4_4_ = fStack_61c * fVar230;
      auVar54._0_4_ = local_620 * fVar229;
      auVar54._8_4_ = fStack_618 * fVar231;
      auVar54._12_4_ = fStack_614 * fVar114;
      auVar54._16_4_ = fStack_610 * fVar115;
      auVar54._20_4_ = fStack_60c * fVar116;
      auVar54._24_4_ = fStack_608 * fVar311;
      auVar54._28_4_ = local_220._28_4_;
      auVar26 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = local_1e0._4_4_ * fVar184;
      auVar55._0_4_ = local_1e0._0_4_ * fVar183;
      auVar55._8_4_ = local_1e0._8_4_ * fVar185;
      auVar55._12_4_ = local_1e0._12_4_ * fVar199;
      auVar55._16_4_ = local_1e0._16_4_ * fVar200;
      auVar55._20_4_ = local_1e0._20_4_ * fVar201;
      auVar55._24_4_ = local_1e0._24_4_ * fVar202;
      auVar55._28_4_ = auVar23._28_4_ + auVar24._28_4_;
      auVar56._4_4_ = auVar109._4_4_ * fVar230;
      auVar56._0_4_ = auVar109._0_4_ * fVar229;
      auVar56._8_4_ = auVar109._8_4_ * fVar231;
      auVar56._12_4_ = auVar109._12_4_ * fVar114;
      auVar56._16_4_ = auVar109._16_4_ * fVar115;
      auVar56._20_4_ = auVar109._20_4_ * fVar116;
      auVar56._24_4_ = auVar109._24_4_ * fVar311;
      auVar56._28_4_ = auVar22._28_4_ + fVar151;
      auVar109 = vsubps_avx(auVar55,auVar56);
      auVar24 = vminps_avx(auVar25,auVar27);
      auVar23 = vmaxps_avx(auVar25,auVar27);
      auVar21 = vminps_avx(auVar110,auVar108);
      auVar21 = vminps_avx(auVar24,auVar21);
      auVar24 = vmaxps_avx(auVar110,auVar108);
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar22 = vminps_avx(auVar146,auVar28);
      auVar24 = vmaxps_avx(auVar146,auVar28);
      auVar108 = vminps_avx(auVar26,auVar109);
      auVar22 = vminps_avx(auVar22,auVar108);
      auVar22 = vminps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar26,auVar109);
      auVar24 = vmaxps_avx(auVar24,auVar21);
      auVar24 = vmaxps_avx(auVar23,auVar24);
      auVar23 = vcmpps_avx(auVar22,local_1c0,2);
      auVar24 = vcmpps_avx(auVar24,local_340,5);
      auVar23 = vandps_avx(auVar24,auVar23);
      auVar107 = vandps_avx(local_2c0,auVar107);
      auVar24 = auVar107 & auVar23;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0x7f,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0xbf,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar24[0x1f] < '\0') {
        auVar107 = vandps_avx(auVar23,auVar107);
        uVar70 = vmovmskps_avx(auVar107);
        if (uVar70 != 0) {
          uVar68 = (ulong)uVar72;
          auStack_4a0[uVar68] = uVar70 & 0xff;
          uVar10 = vmovlps_avx(local_400);
          *(undefined8 *)(afStack_320 + uVar68 * 2) = uVar10;
          uVar65 = vmovlps_avx(auVar92);
          auStack_1a0[uVar68] = uVar65;
          uVar72 = uVar72 + 1;
        }
      }
    }
LAB_00f2df39:
    do {
      do {
        do {
          do {
            if (uVar72 == 0) {
              if (bVar73) {
                return bVar73;
              }
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar106._4_4_ = uVar9;
              auVar106._0_4_ = uVar9;
              auVar106._8_4_ = uVar9;
              auVar106._12_4_ = uVar9;
              auVar88 = vcmpps_avx(local_410,auVar106,2);
              uVar67 = vmovmskps_avx(auVar88);
              uVar63 = uVar63 & local_548 & uVar67;
              if (uVar63 == 0) {
                return bVar73;
              }
              goto LAB_00f2cd04;
            }
            uVar68 = (ulong)(uVar72 - 1);
            uVar70 = auStack_4a0[uVar68];
            fVar151 = afStack_320[uVar68 * 2];
            fVar183 = afStack_320[uVar68 * 2 + 1];
            auVar92._8_8_ = 0;
            auVar92._0_8_ = auStack_1a0[uVar68];
            uVar65 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> uVar65 & 1) == 0; uVar65 = uVar65 + 1) {
              }
            }
            uVar70 = uVar70 - 1 & uVar70;
            auStack_4a0[uVar68] = uVar70;
            if (uVar70 == 0) {
              uVar72 = uVar72 - 1;
            }
            fVar185 = (float)(uVar65 + 1) * 0.14285715;
            fVar184 = (1.0 - (float)uVar65 * 0.14285715) * fVar151 +
                      fVar183 * (float)uVar65 * 0.14285715;
            fVar151 = (1.0 - fVar185) * fVar151 + fVar183 * fVar185;
            fVar183 = fVar151 - fVar184;
            if (0.16666667 <= fVar183) {
              local_400 = vinsertps_avx(ZEXT416((uint)fVar184),ZEXT416((uint)fVar151),0x10);
              goto LAB_00f2d90d;
            }
            auVar88 = vshufps_avx(auVar92,auVar92,0x50);
            auVar128._8_4_ = 0x3f800000;
            auVar128._0_8_ = 0x3f8000003f800000;
            auVar128._12_4_ = 0x3f800000;
            auVar124 = vsubps_avx(auVar128,auVar88);
            fVar185 = auVar88._0_4_;
            fVar199 = auVar88._4_4_;
            fVar200 = auVar88._8_4_;
            fVar201 = auVar88._12_4_;
            fVar202 = auVar124._0_4_;
            fVar229 = auVar124._4_4_;
            fVar230 = auVar124._8_4_;
            fVar231 = auVar124._12_4_;
            auVar165._0_4_ = fVar185 * auVar285._0_4_ + fVar202 * (float)local_6f0._0_4_;
            auVar165._4_4_ = fVar199 * auVar285._4_4_ + fVar229 * (float)local_6f0._4_4_;
            auVar165._8_4_ = fVar200 * auVar285._0_4_ + fVar230 * (float)local_6f0._0_4_;
            auVar165._12_4_ = fVar201 * auVar285._4_4_ + fVar231 * (float)local_6f0._4_4_;
            auVar216._0_4_ = fVar185 * auVar293._0_4_ + fVar202 * fVar250;
            auVar216._4_4_ = fVar199 * auVar293._4_4_ + fVar229 * fVar252;
            auVar216._8_4_ = fVar200 * auVar293._0_4_ + fVar230 * fVar250;
            auVar216._12_4_ = fVar201 * auVar293._4_4_ + fVar231 * fVar252;
            auVar241._0_4_ = fVar185 * auVar307._0_4_ + auVar194._0_4_ * fVar202;
            auVar241._4_4_ = fVar199 * auVar307._4_4_ + auVar194._4_4_ * fVar229;
            auVar241._8_4_ = fVar200 * auVar307._0_4_ + auVar194._0_4_ * fVar230;
            auVar241._12_4_ = fVar201 * auVar307._4_4_ + auVar194._4_4_ * fVar231;
            auVar93._0_4_ = fVar185 * auVar90._0_4_ + fVar202 * auVar127._0_4_;
            auVar93._4_4_ = fVar199 * auVar90._4_4_ + fVar229 * auVar127._4_4_;
            auVar93._8_4_ = fVar200 * auVar90._0_4_ + fVar230 * auVar127._0_4_;
            auVar93._12_4_ = fVar201 * auVar90._4_4_ + fVar231 * auVar127._4_4_;
            auVar147._16_16_ = auVar165;
            auVar147._0_16_ = auVar165;
            auVar180._16_16_ = auVar216;
            auVar180._0_16_ = auVar216;
            auVar228._16_16_ = auVar241;
            auVar228._0_16_ = auVar241;
            auVar107 = ZEXT2032(CONCAT416(fVar151,ZEXT416((uint)fVar184)));
            auVar107 = vshufps_avx(auVar107,auVar107,0);
            auVar23 = vsubps_avx(auVar180,auVar147);
            fVar185 = auVar107._0_4_;
            fVar199 = auVar107._4_4_;
            fVar200 = auVar107._8_4_;
            fVar201 = auVar107._12_4_;
            fVar202 = auVar107._16_4_;
            fVar229 = auVar107._20_4_;
            fVar230 = auVar107._24_4_;
            auVar148._0_4_ = auVar165._0_4_ + auVar23._0_4_ * fVar185;
            auVar148._4_4_ = auVar165._4_4_ + auVar23._4_4_ * fVar199;
            auVar148._8_4_ = auVar165._8_4_ + auVar23._8_4_ * fVar200;
            auVar148._12_4_ = auVar165._12_4_ + auVar23._12_4_ * fVar201;
            auVar148._16_4_ = auVar165._0_4_ + auVar23._16_4_ * fVar202;
            auVar148._20_4_ = auVar165._4_4_ + auVar23._20_4_ * fVar229;
            auVar148._24_4_ = auVar165._8_4_ + auVar23._24_4_ * fVar230;
            auVar148._28_4_ = auVar165._12_4_ + auVar23._28_4_;
            auVar107 = vsubps_avx(auVar228,auVar180);
            auVar181._0_4_ = auVar216._0_4_ + auVar107._0_4_ * fVar185;
            auVar181._4_4_ = auVar216._4_4_ + auVar107._4_4_ * fVar199;
            auVar181._8_4_ = auVar216._8_4_ + auVar107._8_4_ * fVar200;
            auVar181._12_4_ = auVar216._12_4_ + auVar107._12_4_ * fVar201;
            auVar181._16_4_ = auVar216._0_4_ + auVar107._16_4_ * fVar202;
            auVar181._20_4_ = auVar216._4_4_ + auVar107._20_4_ * fVar229;
            auVar181._24_4_ = auVar216._8_4_ + auVar107._24_4_ * fVar230;
            auVar181._28_4_ = auVar216._12_4_ + auVar107._28_4_;
            auVar88 = vsubps_avx(auVar93,auVar241);
            auVar111._0_4_ = auVar241._0_4_ + auVar88._0_4_ * fVar185;
            auVar111._4_4_ = auVar241._4_4_ + auVar88._4_4_ * fVar199;
            auVar111._8_4_ = auVar241._8_4_ + auVar88._8_4_ * fVar200;
            auVar111._12_4_ = auVar241._12_4_ + auVar88._12_4_ * fVar201;
            auVar111._16_4_ = auVar241._0_4_ + auVar88._0_4_ * fVar202;
            auVar111._20_4_ = auVar241._4_4_ + auVar88._4_4_ * fVar229;
            auVar111._24_4_ = auVar241._8_4_ + auVar88._8_4_ * fVar230;
            auVar111._28_4_ = auVar241._12_4_ + auVar88._12_4_;
            auVar107 = vsubps_avx(auVar181,auVar148);
            auVar149._0_4_ = auVar148._0_4_ + fVar185 * auVar107._0_4_;
            auVar149._4_4_ = auVar148._4_4_ + fVar199 * auVar107._4_4_;
            auVar149._8_4_ = auVar148._8_4_ + fVar200 * auVar107._8_4_;
            auVar149._12_4_ = auVar148._12_4_ + fVar201 * auVar107._12_4_;
            auVar149._16_4_ = auVar148._16_4_ + fVar202 * auVar107._16_4_;
            auVar149._20_4_ = auVar148._20_4_ + fVar229 * auVar107._20_4_;
            auVar149._24_4_ = auVar148._24_4_ + fVar230 * auVar107._24_4_;
            auVar149._28_4_ = auVar148._28_4_ + auVar107._28_4_;
            auVar107 = vsubps_avx(auVar111,auVar181);
            auVar112._0_4_ = auVar181._0_4_ + fVar185 * auVar107._0_4_;
            auVar112._4_4_ = auVar181._4_4_ + fVar199 * auVar107._4_4_;
            auVar112._8_4_ = auVar181._8_4_ + fVar200 * auVar107._8_4_;
            auVar112._12_4_ = auVar181._12_4_ + fVar201 * auVar107._12_4_;
            auVar112._16_4_ = auVar181._16_4_ + fVar202 * auVar107._16_4_;
            auVar112._20_4_ = auVar181._20_4_ + fVar229 * auVar107._20_4_;
            auVar112._24_4_ = auVar181._24_4_ + fVar230 * auVar107._24_4_;
            auVar112._28_4_ = auVar181._28_4_ + auVar107._28_4_;
            auVar107 = vsubps_avx(auVar112,auVar149);
            auVar258._0_4_ = auVar149._0_4_ + fVar185 * auVar107._0_4_;
            auVar258._4_4_ = auVar149._4_4_ + fVar199 * auVar107._4_4_;
            auVar258._8_4_ = auVar149._8_4_ + fVar200 * auVar107._8_4_;
            auVar258._12_4_ = auVar149._12_4_ + fVar201 * auVar107._12_4_;
            auVar261._16_4_ = auVar149._16_4_ + fVar202 * auVar107._16_4_;
            auVar261._0_16_ = auVar258;
            auVar261._20_4_ = auVar149._20_4_ + fVar229 * auVar107._20_4_;
            auVar261._24_4_ = auVar149._24_4_ + fVar230 * auVar107._24_4_;
            auVar261._28_4_ = auVar149._28_4_ + auVar181._28_4_;
            auVar262 = auVar261._16_16_;
            auVar130 = vshufps_avx(ZEXT416((uint)(fVar183 * 0.33333334)),
                                   ZEXT416((uint)(fVar183 * 0.33333334)),0);
            auVar242._0_4_ = auVar258._0_4_ + auVar130._0_4_ * auVar107._0_4_ * 3.0;
            auVar242._4_4_ = auVar258._4_4_ + auVar130._4_4_ * auVar107._4_4_ * 3.0;
            auVar242._8_4_ = auVar258._8_4_ + auVar130._8_4_ * auVar107._8_4_ * 3.0;
            auVar242._12_4_ = auVar258._12_4_ + auVar130._12_4_ * auVar107._12_4_ * 3.0;
            auVar178 = vshufpd_avx(auVar258,auVar258,3);
            auVar141 = vshufpd_avx(auVar262,auVar262,3);
            auVar88 = vsubps_avx(auVar178,auVar258);
            auVar124 = vsubps_avx(auVar141,auVar262);
            auVar94._0_4_ = auVar88._0_4_ + auVar124._0_4_;
            auVar94._4_4_ = auVar88._4_4_ + auVar124._4_4_;
            auVar94._8_4_ = auVar88._8_4_ + auVar124._8_4_;
            auVar94._12_4_ = auVar88._12_4_ + auVar124._12_4_;
            auVar88 = vmovshdup_avx(auVar258);
            auVar124 = vmovshdup_avx(auVar242);
            auVar168 = vshufps_avx(auVar94,auVar94,0);
            auVar131 = vshufps_avx(auVar94,auVar94,0x55);
            fVar185 = auVar131._0_4_;
            fVar199 = auVar131._4_4_;
            fVar200 = auVar131._8_4_;
            fVar201 = auVar131._12_4_;
            fVar202 = auVar168._0_4_;
            fVar229 = auVar168._4_4_;
            fVar230 = auVar168._8_4_;
            fVar231 = auVar168._12_4_;
            auVar95._0_4_ = fVar202 * auVar258._0_4_ + auVar88._0_4_ * fVar185;
            auVar95._4_4_ = fVar229 * auVar258._4_4_ + auVar88._4_4_ * fVar199;
            auVar95._8_4_ = fVar230 * auVar258._8_4_ + auVar88._8_4_ * fVar200;
            auVar95._12_4_ = fVar231 * auVar258._12_4_ + auVar88._12_4_ * fVar201;
            auVar166._0_4_ = fVar202 * auVar242._0_4_ + auVar124._0_4_ * fVar185;
            auVar166._4_4_ = fVar229 * auVar242._4_4_ + auVar124._4_4_ * fVar199;
            auVar166._8_4_ = fVar230 * auVar242._8_4_ + auVar124._8_4_ * fVar200;
            auVar166._12_4_ = fVar231 * auVar242._12_4_ + auVar124._12_4_ * fVar201;
            auVar124 = vshufps_avx(auVar95,auVar95,0xe8);
            auVar168 = vshufps_avx(auVar166,auVar166,0xe8);
            auVar88 = vcmpps_avx(auVar124,auVar168,1);
            uVar70 = vextractps_avx(auVar88,0);
            auVar131 = auVar166;
            if ((uVar70 & 1) == 0) {
              auVar131 = auVar95;
            }
            auVar129._0_4_ = auVar130._0_4_ * auVar107._16_4_ * 3.0;
            auVar129._4_4_ = auVar130._4_4_ * auVar107._20_4_ * 3.0;
            auVar129._8_4_ = auVar130._8_4_ * auVar107._24_4_ * 3.0;
            auVar129._12_4_ = auVar130._12_4_ * 0.0;
            auVar76 = vsubps_avx(auVar262,auVar129);
            auVar130 = vmovshdup_avx(auVar76);
            auVar262 = vmovshdup_avx(auVar262);
            fVar114 = auVar76._0_4_;
            fVar115 = auVar76._4_4_;
            auVar217._0_4_ = fVar114 * fVar202 + auVar130._0_4_ * fVar185;
            auVar217._4_4_ = fVar115 * fVar229 + auVar130._4_4_ * fVar199;
            auVar217._8_4_ = auVar76._8_4_ * fVar230 + auVar130._8_4_ * fVar200;
            auVar217._12_4_ = auVar76._12_4_ * fVar231 + auVar130._12_4_ * fVar201;
            auVar243._0_4_ = fVar202 * auVar261._16_4_ + auVar262._0_4_ * fVar185;
            auVar243._4_4_ = fVar229 * auVar261._20_4_ + auVar262._4_4_ * fVar199;
            auVar243._8_4_ = fVar230 * auVar261._24_4_ + auVar262._8_4_ * fVar200;
            auVar243._12_4_ = fVar231 * auVar261._28_4_ + auVar262._12_4_ * fVar201;
            auVar262 = vshufps_avx(auVar217,auVar217,0xe8);
            auVar20 = vshufps_avx(auVar243,auVar243,0xe8);
            auVar130 = vcmpps_avx(auVar262,auVar20,1);
            uVar70 = vextractps_avx(auVar130,0);
            auVar77 = auVar243;
            if ((uVar70 & 1) == 0) {
              auVar77 = auVar217;
            }
            auVar131 = vmaxss_avx(auVar77,auVar131);
            auVar124 = vminps_avx(auVar124,auVar168);
            auVar168 = vminps_avx(auVar262,auVar20);
            auVar168 = vminps_avx(auVar124,auVar168);
            auVar88 = vshufps_avx(auVar88,auVar88,0x55);
            auVar88 = vblendps_avx(auVar88,auVar130,2);
            auVar130 = vpslld_avx(auVar88,0x1f);
            auVar88 = vshufpd_avx(auVar166,auVar166,1);
            auVar88 = vinsertps_avx(auVar88,auVar243,0x9c);
            auVar124 = vshufpd_avx(auVar95,auVar95,1);
            auVar124 = vinsertps_avx(auVar124,auVar217,0x9c);
            auVar88 = vblendvps_avx(auVar124,auVar88,auVar130);
            auVar124 = vmovshdup_avx(auVar88);
            auVar88 = vmaxss_avx(auVar124,auVar88);
            fVar200 = auVar168._0_4_;
            auVar124 = vmovshdup_avx(auVar168);
            fVar199 = auVar88._0_4_;
            fVar201 = auVar124._0_4_;
            fVar185 = auVar131._0_4_;
            if ((fVar200 < 0.0001) && (-0.0001 < fVar199)) break;
            if ((fVar201 < 0.0001 && -0.0001 < fVar185) || (fVar200 < 0.0001 && -0.0001 < fVar185))
            break;
            auVar130 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar88,1);
            auVar124 = vcmpps_avx(auVar124,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar124 = vandps_avx(auVar124,auVar130);
          } while ((auVar124 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar130 = vcmpps_avx(auVar168,_DAT_01f7aa10,1);
          auVar124 = vcmpss_avx(auVar131,ZEXT416(0),1);
          auVar167._8_4_ = 0x3f800000;
          auVar167._0_8_ = 0x3f8000003f800000;
          auVar167._12_4_ = 0x3f800000;
          auVar218._8_4_ = 0xbf800000;
          auVar218._0_8_ = 0xbf800000bf800000;
          auVar218._12_4_ = 0xbf800000;
          auVar124 = vblendvps_avx(auVar167,auVar218,auVar124);
          auVar130 = vblendvps_avx(auVar167,auVar218,auVar130);
          auVar168 = vcmpss_avx(auVar130,auVar124,4);
          auVar168 = vpshufd_avx(ZEXT416(auVar168._0_4_ & 1),0x50);
          auVar168 = vpslld_avx(auVar168,0x1f);
          auVar168 = vpsrad_avx(auVar168,0x1f);
          auVar168 = vpandn_avx(auVar168,_DAT_01fafeb0);
          auVar131 = vmovshdup_avx(auVar130);
          fVar202 = auVar131._0_4_;
          if ((auVar130._0_4_ != fVar202) || (NAN(auVar130._0_4_) || NAN(fVar202))) {
            if ((fVar201 != fVar200) || (NAN(fVar201) || NAN(fVar200))) {
              fVar200 = -fVar200 / (fVar201 - fVar200);
              auVar130 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar200) * 0.0 + fVar200)));
            }
            else {
              auVar130 = ZEXT816(0x3f80000000000000);
              if ((fVar200 != 0.0) || (NAN(fVar200))) {
                auVar130 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar262 = vcmpps_avx(auVar168,auVar130,1);
            auVar131 = vblendps_avx(auVar168,auVar130,2);
            auVar130 = vblendps_avx(auVar130,auVar168,2);
            auVar168 = vblendvps_avx(auVar130,auVar131,auVar262);
          }
          auVar88 = vcmpss_avx(auVar88,ZEXT416(0),1);
          auVar169._8_4_ = 0x3f800000;
          auVar169._0_8_ = 0x3f8000003f800000;
          auVar169._12_4_ = 0x3f800000;
          auVar219._8_4_ = 0xbf800000;
          auVar219._0_8_ = 0xbf800000bf800000;
          auVar219._12_4_ = 0xbf800000;
          auVar88 = vblendvps_avx(auVar169,auVar219,auVar88);
          fVar200 = auVar88._0_4_;
          if ((auVar124._0_4_ != fVar200) || (NAN(auVar124._0_4_) || NAN(fVar200))) {
            if ((fVar199 != fVar185) || (NAN(fVar199) || NAN(fVar185))) {
              fVar185 = -fVar185 / (fVar199 - fVar185);
              auVar88 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar185) * 0.0 + fVar185)));
            }
            else {
              auVar88 = ZEXT816(0x3f80000000000000);
              if ((fVar185 != 0.0) || (NAN(fVar185))) {
                auVar88 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar130 = vcmpps_avx(auVar168,auVar88,1);
            auVar124 = vblendps_avx(auVar168,auVar88,2);
            auVar88 = vblendps_avx(auVar88,auVar168,2);
            auVar168 = vblendvps_avx(auVar88,auVar124,auVar130);
          }
          if ((fVar202 != fVar200) || (NAN(fVar202) || NAN(fVar200))) {
            auVar96._8_4_ = 0x3f800000;
            auVar96._0_8_ = 0x3f8000003f800000;
            auVar96._12_4_ = 0x3f800000;
            auVar88 = vcmpps_avx(auVar168,auVar96,1);
            auVar124 = vinsertps_avx(auVar168,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar170._4_12_ = auVar168._4_12_;
            auVar170._0_4_ = 0x3f800000;
            auVar168 = vblendvps_avx(auVar170,auVar124,auVar88);
          }
          auVar88 = vcmpps_avx(auVar168,_DAT_01f7b6f0,1);
          auVar58._12_4_ = 0;
          auVar58._0_12_ = auVar168._4_12_;
          auVar124 = vinsertps_avx(auVar168,ZEXT416(0x3f800000),0x10);
          auVar88 = vblendvps_avx(auVar124,auVar58 << 0x20,auVar88);
          auVar124 = vmovshdup_avx(auVar88);
        } while (auVar124._0_4_ < auVar88._0_4_);
        auVar97._0_4_ = auVar88._0_4_ + -0.1;
        auVar97._4_4_ = auVar88._4_4_ + 0.1;
        auVar97._8_4_ = auVar88._8_4_ + 0.0;
        auVar97._12_4_ = auVar88._12_4_ + 0.0;
        auVar130 = vshufpd_avx(auVar242,auVar242,3);
        auVar259._8_8_ = 0x3f80000000000000;
        auVar259._0_8_ = 0x3f80000000000000;
        auVar88 = vcmpps_avx(auVar97,auVar259,1);
        auVar57._12_4_ = 0;
        auVar57._0_12_ = auVar97._4_12_;
        auVar124 = vinsertps_avx(auVar97,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar88 = vblendvps_avx(auVar124,auVar57 << 0x20,auVar88);
        auVar124 = vshufpd_avx(auVar76,auVar76,3);
        auVar168 = vshufps_avx(auVar88,auVar88,0x50);
        auVar260._8_4_ = 0x3f800000;
        auVar260._0_8_ = 0x3f8000003f800000;
        auVar260._12_4_ = 0x3f800000;
        auVar131 = vsubps_avx(auVar260,auVar168);
        local_600 = auVar178._0_4_;
        fStack_5fc = auVar178._4_4_;
        fStack_5f8 = auVar178._8_4_;
        fStack_5f4 = auVar178._12_4_;
        fVar185 = auVar168._0_4_;
        fVar199 = auVar168._4_4_;
        fVar200 = auVar168._8_4_;
        fVar201 = auVar168._12_4_;
        local_6a0 = auVar141._0_4_;
        fStack_69c = auVar141._4_4_;
        fStack_698 = auVar141._8_4_;
        fStack_694 = auVar141._12_4_;
        fVar202 = auVar131._0_4_;
        fVar229 = auVar131._4_4_;
        fVar230 = auVar131._8_4_;
        fVar231 = auVar131._12_4_;
        auVar98._0_4_ = fVar185 * local_600 + fVar202 * auVar258._0_4_;
        auVar98._4_4_ = fVar199 * fStack_5fc + fVar229 * auVar258._4_4_;
        auVar98._8_4_ = fVar200 * fStack_5f8 + fVar230 * auVar258._0_4_;
        auVar98._12_4_ = fVar201 * fStack_5f4 + fVar231 * auVar258._4_4_;
        auVar171._0_4_ = fVar185 * auVar130._0_4_ + fVar202 * auVar242._0_4_;
        auVar171._4_4_ = fVar199 * auVar130._4_4_ + fVar229 * auVar242._4_4_;
        auVar171._8_4_ = fVar200 * auVar130._8_4_ + fVar230 * auVar242._0_4_;
        auVar171._12_4_ = fVar201 * auVar130._12_4_ + fVar231 * auVar242._4_4_;
        auVar244._0_4_ = fVar185 * auVar124._0_4_ + fVar202 * fVar114;
        auVar244._4_4_ = fVar199 * auVar124._4_4_ + fVar229 * fVar115;
        auVar244._8_4_ = fVar200 * auVar124._8_4_ + fVar230 * fVar114;
        auVar244._12_4_ = fVar201 * auVar124._12_4_ + fVar231 * fVar115;
        auVar271._0_4_ = fVar185 * local_6a0 + fVar202 * auVar261._16_4_;
        auVar271._4_4_ = fVar199 * fStack_69c + fVar229 * auVar261._20_4_;
        auVar271._8_4_ = fVar200 * fStack_698 + fVar230 * auVar261._16_4_;
        auVar271._12_4_ = fVar201 * fStack_694 + fVar231 * auVar261._20_4_;
        auVar141 = vsubps_avx(auVar260,auVar88);
        auVar124 = vmovshdup_avx(auVar92);
        auVar178 = vmovsldup_avx(auVar92);
        auVar92._0_4_ = auVar178._0_4_ * auVar141._0_4_ + auVar88._0_4_ * auVar124._0_4_;
        auVar92._4_4_ = auVar178._4_4_ * auVar141._4_4_ + auVar88._4_4_ * auVar124._4_4_;
        auVar92._8_4_ = auVar178._8_4_ * auVar141._8_4_ + auVar88._8_4_ * auVar124._8_4_;
        auVar92._12_4_ = auVar178._12_4_ * auVar141._12_4_ + auVar88._12_4_ * auVar124._12_4_;
        auVar76 = vmovshdup_avx(auVar92);
        auVar88 = vsubps_avx(auVar171,auVar98);
        auVar196._0_4_ = auVar88._0_4_ * 3.0;
        auVar196._4_4_ = auVar88._4_4_ * 3.0;
        auVar196._8_4_ = auVar88._8_4_ * 3.0;
        auVar196._12_4_ = auVar88._12_4_ * 3.0;
        auVar88 = vsubps_avx(auVar244,auVar171);
        auVar286._0_4_ = auVar88._0_4_ * 3.0;
        auVar286._4_4_ = auVar88._4_4_ * 3.0;
        auVar286._8_4_ = auVar88._8_4_ * 3.0;
        auVar286._12_4_ = auVar88._12_4_ * 3.0;
        auVar88 = vsubps_avx(auVar271,auVar244);
        auVar294._0_4_ = auVar88._0_4_ * 3.0;
        auVar294._4_4_ = auVar88._4_4_ * 3.0;
        auVar294._8_4_ = auVar88._8_4_ * 3.0;
        auVar294._12_4_ = auVar88._12_4_ * 3.0;
        auVar124 = vminps_avx(auVar286,auVar294);
        auVar88 = vmaxps_avx(auVar286,auVar294);
        auVar124 = vminps_avx(auVar196,auVar124);
        auVar88 = vmaxps_avx(auVar196,auVar88);
        auVar178 = vshufpd_avx(auVar124,auVar124,3);
        auVar141 = vshufpd_avx(auVar88,auVar88,3);
        auVar124 = vminps_avx(auVar124,auVar178);
        auVar88 = vmaxps_avx(auVar88,auVar141);
        auVar178 = vshufps_avx(ZEXT416((uint)(1.0 / fVar183)),ZEXT416((uint)(1.0 / fVar183)),0);
        auVar287._0_4_ = auVar124._0_4_ * auVar178._0_4_;
        auVar287._4_4_ = auVar124._4_4_ * auVar178._4_4_;
        auVar287._8_4_ = auVar124._8_4_ * auVar178._8_4_;
        auVar287._12_4_ = auVar124._12_4_ * auVar178._12_4_;
        auVar295._0_4_ = auVar178._0_4_ * auVar88._0_4_;
        auVar295._4_4_ = auVar178._4_4_ * auVar88._4_4_;
        auVar295._8_4_ = auVar178._8_4_ * auVar88._8_4_;
        auVar295._12_4_ = auVar178._12_4_ * auVar88._12_4_;
        auVar131 = ZEXT416((uint)(1.0 / (auVar76._0_4_ - auVar92._0_4_)));
        auVar88 = vshufpd_avx(auVar98,auVar98,3);
        auVar124 = vshufpd_avx(auVar171,auVar171,3);
        auVar178 = vshufpd_avx(auVar244,auVar244,3);
        auVar141 = vshufpd_avx(auVar271,auVar271,3);
        auVar88 = vsubps_avx(auVar88,auVar98);
        auVar130 = vsubps_avx(auVar124,auVar171);
        auVar168 = vsubps_avx(auVar178,auVar244);
        auVar141 = vsubps_avx(auVar141,auVar271);
        auVar124 = vminps_avx(auVar88,auVar130);
        auVar88 = vmaxps_avx(auVar88,auVar130);
        auVar178 = vminps_avx(auVar168,auVar141);
        auVar178 = vminps_avx(auVar124,auVar178);
        auVar124 = vmaxps_avx(auVar168,auVar141);
        auVar88 = vmaxps_avx(auVar88,auVar124);
        auVar124 = vshufps_avx(auVar131,auVar131,0);
        auVar340._0_4_ = auVar124._0_4_ * auVar178._0_4_;
        auVar340._4_4_ = auVar124._4_4_ * auVar178._4_4_;
        auVar340._8_4_ = auVar124._8_4_ * auVar178._8_4_;
        auVar340._12_4_ = auVar124._12_4_ * auVar178._12_4_;
        auVar350._0_4_ = auVar124._0_4_ * auVar88._0_4_;
        auVar350._4_4_ = auVar124._4_4_ * auVar88._4_4_;
        auVar350._8_4_ = auVar124._8_4_ * auVar88._8_4_;
        auVar350._12_4_ = auVar124._12_4_ * auVar88._12_4_;
        auVar88 = vmovsldup_avx(auVar92);
        auVar308._4_12_ = auVar88._4_12_;
        auVar308._0_4_ = fVar184;
        auVar314._4_12_ = auVar92._4_12_;
        auVar314._0_4_ = fVar151;
        auVar197._0_4_ = (fVar184 + fVar151) * 0.5;
        auVar197._4_4_ = (auVar88._4_4_ + auVar92._4_4_) * 0.5;
        auVar197._8_4_ = (auVar88._8_4_ + auVar92._8_4_) * 0.5;
        auVar197._12_4_ = (auVar88._12_4_ + auVar92._12_4_) * 0.5;
        auVar88 = vshufps_avx(auVar197,auVar197,0);
        fVar185 = auVar88._0_4_;
        fVar199 = auVar88._4_4_;
        fVar200 = auVar88._8_4_;
        fVar201 = auVar88._12_4_;
        local_630._0_4_ = auVar281._0_4_;
        local_630._4_4_ = auVar281._4_4_;
        fStack_628 = auVar281._8_4_;
        fStack_624 = auVar281._12_4_;
        auVar132._0_4_ = fVar185 * (float)local_350._0_4_ + (float)local_630._0_4_;
        auVar132._4_4_ = fVar199 * (float)local_350._4_4_ + (float)local_630._4_4_;
        auVar132._8_4_ = fVar200 * fStack_348 + fStack_628;
        auVar132._12_4_ = fVar201 * fStack_344 + fStack_624;
        local_640 = auVar18._0_4_;
        fStack_63c = auVar18._4_4_;
        fStack_638 = auVar18._8_4_;
        fStack_634 = auVar18._12_4_;
        auVar172._0_4_ = fVar185 * (float)local_360._0_4_ + local_640;
        auVar172._4_4_ = fVar199 * (float)local_360._4_4_ + fStack_63c;
        auVar172._8_4_ = fVar200 * fStack_358 + fStack_638;
        auVar172._12_4_ = fVar201 * fStack_354 + fStack_634;
        local_650 = auVar19._0_4_;
        fStack_64c = auVar19._4_4_;
        fStack_648 = auVar19._8_4_;
        fStack_644 = auVar19._12_4_;
        auVar245._0_4_ = fVar185 * (float)local_370._0_4_ + local_650;
        auVar245._4_4_ = fVar199 * (float)local_370._4_4_ + fStack_64c;
        auVar245._8_4_ = fVar200 * fStack_368 + fStack_648;
        auVar245._12_4_ = fVar201 * fStack_364 + fStack_644;
        auVar88 = vsubps_avx(auVar172,auVar132);
        auVar133._0_4_ = auVar132._0_4_ + fVar185 * auVar88._0_4_;
        auVar133._4_4_ = auVar132._4_4_ + fVar199 * auVar88._4_4_;
        auVar133._8_4_ = auVar132._8_4_ + fVar200 * auVar88._8_4_;
        auVar133._12_4_ = auVar132._12_4_ + fVar201 * auVar88._12_4_;
        auVar88 = vsubps_avx(auVar245,auVar172);
        auVar173._0_4_ = auVar172._0_4_ + fVar185 * auVar88._0_4_;
        auVar173._4_4_ = auVar172._4_4_ + fVar199 * auVar88._4_4_;
        auVar173._8_4_ = auVar172._8_4_ + fVar200 * auVar88._8_4_;
        auVar173._12_4_ = auVar172._12_4_ + fVar201 * auVar88._12_4_;
        auVar88 = vsubps_avx(auVar173,auVar133);
        fVar185 = auVar133._0_4_ + fVar185 * auVar88._0_4_;
        fVar199 = auVar133._4_4_ + fVar199 * auVar88._4_4_;
        auVar99._0_8_ = CONCAT44(fVar199,fVar185);
        auVar99._8_4_ = auVar133._8_4_ + fVar200 * auVar88._8_4_;
        auVar99._12_4_ = auVar133._12_4_ + fVar201 * auVar88._12_4_;
        fVar200 = auVar88._0_4_ * 3.0;
        fVar201 = auVar88._4_4_ * 3.0;
        auVar134._0_8_ = CONCAT44(fVar201,fVar200);
        auVar134._8_4_ = auVar88._8_4_ * 3.0;
        auVar134._12_4_ = auVar88._12_4_ * 3.0;
        auVar174._8_8_ = auVar99._0_8_;
        auVar174._0_8_ = auVar99._0_8_;
        auVar88 = vshufpd_avx(auVar99,auVar99,3);
        auVar124 = vshufps_avx(auVar197,auVar197,0x55);
        auVar168 = vsubps_avx(auVar88,auVar174);
        auVar329._0_4_ = auVar168._0_4_ * auVar124._0_4_ + fVar185;
        auVar329._4_4_ = auVar168._4_4_ * auVar124._4_4_ + fVar199;
        auVar329._8_4_ = auVar168._8_4_ * auVar124._8_4_ + fVar185;
        auVar329._12_4_ = auVar168._12_4_ * auVar124._12_4_ + fVar199;
        auVar175._8_8_ = auVar134._0_8_;
        auVar175._0_8_ = auVar134._0_8_;
        auVar88 = vshufpd_avx(auVar134,auVar134,1);
        auVar88 = vsubps_avx(auVar88,auVar175);
        auVar135._0_4_ = auVar88._0_4_ * auVar124._0_4_ + fVar200;
        auVar135._4_4_ = auVar88._4_4_ * auVar124._4_4_ + fVar201;
        auVar135._8_4_ = auVar88._8_4_ * auVar124._8_4_ + fVar200;
        auVar135._12_4_ = auVar88._12_4_ * auVar124._12_4_ + fVar201;
        auVar124 = vmovshdup_avx(auVar135);
        auVar246._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
        auVar246._8_4_ = auVar124._8_4_ ^ 0x80000000;
        auVar246._12_4_ = auVar124._12_4_ ^ 0x80000000;
        auVar178 = vmovshdup_avx(auVar168);
        auVar88 = vunpcklps_avx(auVar178,auVar246);
        auVar141 = vshufps_avx(auVar88,auVar246,4);
        auVar100._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
        auVar100._8_4_ = -auVar168._8_4_;
        auVar100._12_4_ = -auVar168._12_4_;
        auVar88 = vmovlhps_avx(auVar100,auVar135);
        auVar130 = vshufps_avx(auVar88,auVar135,8);
        auVar88 = ZEXT416((uint)(auVar135._0_4_ * auVar178._0_4_ - auVar168._0_4_ * auVar124._0_4_))
        ;
        auVar124 = vshufps_avx(auVar88,auVar88,0);
        auVar88 = vdivps_avx(auVar141,auVar124);
        auVar124 = vdivps_avx(auVar130,auVar124);
        auVar130 = vinsertps_avx(auVar287,auVar340,0x1c);
        auVar168 = vinsertps_avx(auVar295,auVar350,0x1c);
        auVar131 = vinsertps_avx(auVar340,auVar287,0x4c);
        auVar262 = vinsertps_avx(auVar350,auVar295,0x4c);
        auVar178 = vmovsldup_avx(auVar88);
        auVar296._0_4_ = auVar130._0_4_ * auVar178._0_4_;
        auVar296._4_4_ = auVar130._4_4_ * auVar178._4_4_;
        auVar296._8_4_ = auVar130._8_4_ * auVar178._8_4_;
        auVar296._12_4_ = auVar130._12_4_ * auVar178._12_4_;
        auVar136._0_4_ = auVar178._0_4_ * auVar168._0_4_;
        auVar136._4_4_ = auVar178._4_4_ * auVar168._4_4_;
        auVar136._8_4_ = auVar178._8_4_ * auVar168._8_4_;
        auVar136._12_4_ = auVar178._12_4_ * auVar168._12_4_;
        auVar141 = vminps_avx(auVar296,auVar136);
        auVar178 = vmaxps_avx(auVar136,auVar296);
        auVar20 = vmovsldup_avx(auVar124);
        auVar351._0_4_ = auVar20._0_4_ * auVar131._0_4_;
        auVar351._4_4_ = auVar20._4_4_ * auVar131._4_4_;
        auVar351._8_4_ = auVar20._8_4_ * auVar131._8_4_;
        auVar351._12_4_ = auVar20._12_4_ * auVar131._12_4_;
        auVar297._0_4_ = auVar20._0_4_ * auVar262._0_4_;
        auVar297._4_4_ = auVar20._4_4_ * auVar262._4_4_;
        auVar297._8_4_ = auVar20._8_4_ * auVar262._8_4_;
        auVar297._12_4_ = auVar20._12_4_ * auVar262._12_4_;
        auVar20 = vminps_avx(auVar351,auVar297);
        auVar220._0_4_ = auVar141._0_4_ + auVar20._0_4_;
        auVar220._4_4_ = auVar141._4_4_ + auVar20._4_4_;
        auVar220._8_4_ = auVar141._8_4_ + auVar20._8_4_;
        auVar220._12_4_ = auVar141._12_4_ + auVar20._12_4_;
        auVar141 = vmaxps_avx(auVar297,auVar351);
        auVar20 = vsubps_avx(auVar308,auVar197);
        auVar77 = vsubps_avx(auVar314,auVar197);
        auVar137._0_4_ = auVar141._0_4_ + auVar178._0_4_;
        auVar137._4_4_ = auVar141._4_4_ + auVar178._4_4_;
        auVar137._8_4_ = auVar141._8_4_ + auVar178._8_4_;
        auVar137._12_4_ = auVar141._12_4_ + auVar178._12_4_;
        auVar315._8_8_ = 0x3f800000;
        auVar315._0_8_ = 0x3f800000;
        auVar178 = vsubps_avx(auVar315,auVar137);
        auVar141 = vsubps_avx(auVar315,auVar220);
        fVar230 = auVar20._0_4_;
        auVar316._0_4_ = fVar230 * auVar178._0_4_;
        fVar231 = auVar20._4_4_;
        auVar316._4_4_ = fVar231 * auVar178._4_4_;
        fVar114 = auVar20._8_4_;
        auVar316._8_4_ = fVar114 * auVar178._8_4_;
        fVar115 = auVar20._12_4_;
        auVar316._12_4_ = fVar115 * auVar178._12_4_;
        fVar200 = auVar77._0_4_;
        auVar138._0_4_ = fVar200 * auVar178._0_4_;
        fVar201 = auVar77._4_4_;
        auVar138._4_4_ = fVar201 * auVar178._4_4_;
        fVar202 = auVar77._8_4_;
        auVar138._8_4_ = fVar202 * auVar178._8_4_;
        fVar229 = auVar77._12_4_;
        auVar138._12_4_ = fVar229 * auVar178._12_4_;
        auVar341._0_4_ = fVar230 * auVar141._0_4_;
        auVar341._4_4_ = fVar231 * auVar141._4_4_;
        auVar341._8_4_ = fVar114 * auVar141._8_4_;
        auVar341._12_4_ = fVar115 * auVar141._12_4_;
        auVar221._0_4_ = fVar200 * auVar141._0_4_;
        auVar221._4_4_ = fVar201 * auVar141._4_4_;
        auVar221._8_4_ = fVar202 * auVar141._8_4_;
        auVar221._12_4_ = fVar229 * auVar141._12_4_;
        auVar178 = vminps_avx(auVar316,auVar341);
        auVar141 = vminps_avx(auVar138,auVar221);
        auVar20 = vminps_avx(auVar178,auVar141);
        auVar178 = vmaxps_avx(auVar341,auVar316);
        auVar141 = vmaxps_avx(auVar221,auVar138);
        auVar77 = vshufps_avx(auVar197,auVar197,0x54);
        auVar141 = vmaxps_avx(auVar141,auVar178);
        auVar87 = vshufps_avx(auVar329,auVar329,0);
        auVar117 = vshufps_avx(auVar329,auVar329,0x55);
        auVar178 = vhaddps_avx(auVar20,auVar20);
        auVar141 = vhaddps_avx(auVar141,auVar141);
        auVar222._0_4_ = auVar117._0_4_ * auVar124._0_4_ + auVar87._0_4_ * auVar88._0_4_;
        auVar222._4_4_ = auVar117._4_4_ * auVar124._4_4_ + auVar87._4_4_ * auVar88._4_4_;
        auVar222._8_4_ = auVar117._8_4_ * auVar124._8_4_ + auVar87._8_4_ * auVar88._8_4_;
        auVar222._12_4_ = auVar117._12_4_ * auVar124._12_4_ + auVar87._12_4_ * auVar88._12_4_;
        auVar20 = vsubps_avx(auVar77,auVar222);
        fVar185 = auVar20._0_4_ + auVar178._0_4_;
        fVar199 = auVar20._0_4_ + auVar141._0_4_;
        auVar178 = vmaxss_avx(ZEXT416((uint)fVar184),ZEXT416((uint)fVar185));
        auVar141 = vminss_avx(ZEXT416((uint)fVar199),ZEXT416((uint)fVar151));
      } while (auVar141._0_4_ < auVar178._0_4_);
      auVar178 = vmovshdup_avx(auVar88);
      auVar223._0_4_ = auVar130._0_4_ * auVar178._0_4_;
      auVar223._4_4_ = auVar130._4_4_ * auVar178._4_4_;
      auVar223._8_4_ = auVar130._8_4_ * auVar178._8_4_;
      auVar223._12_4_ = auVar130._12_4_ * auVar178._12_4_;
      auVar139._0_4_ = auVar178._0_4_ * auVar168._0_4_;
      auVar139._4_4_ = auVar178._4_4_ * auVar168._4_4_;
      auVar139._8_4_ = auVar178._8_4_ * auVar168._8_4_;
      auVar139._12_4_ = auVar178._12_4_ * auVar168._12_4_;
      auVar141 = vminps_avx(auVar223,auVar139);
      auVar178 = vmaxps_avx(auVar139,auVar223);
      auVar130 = vmovshdup_avx(auVar124);
      auVar101._0_4_ = auVar130._0_4_ * auVar131._0_4_;
      auVar101._4_4_ = auVar130._4_4_ * auVar131._4_4_;
      auVar101._8_4_ = auVar130._8_4_ * auVar131._8_4_;
      auVar101._12_4_ = auVar130._12_4_ * auVar131._12_4_;
      auVar224._0_4_ = auVar262._0_4_ * auVar130._0_4_;
      auVar224._4_4_ = auVar262._4_4_ * auVar130._4_4_;
      auVar224._8_4_ = auVar262._8_4_ * auVar130._8_4_;
      auVar224._12_4_ = auVar262._12_4_ * auVar130._12_4_;
      auVar130 = vminps_avx(auVar101,auVar224);
      auVar176._0_4_ = auVar141._0_4_ + auVar130._0_4_;
      auVar176._4_4_ = auVar141._4_4_ + auVar130._4_4_;
      auVar176._8_4_ = auVar141._8_4_ + auVar130._8_4_;
      auVar176._12_4_ = auVar141._12_4_ + auVar130._12_4_;
      auVar141 = vmaxps_avx(auVar224,auVar101);
      auVar102._0_4_ = auVar178._0_4_ + auVar141._0_4_;
      auVar102._4_4_ = auVar178._4_4_ + auVar141._4_4_;
      auVar102._8_4_ = auVar178._8_4_ + auVar141._8_4_;
      auVar102._12_4_ = auVar178._12_4_ + auVar141._12_4_;
      auVar178 = vsubps_avx(auVar259,auVar102);
      auVar141 = vsubps_avx(auVar259,auVar176);
      auVar177._0_4_ = fVar230 * auVar178._0_4_;
      auVar177._4_4_ = fVar231 * auVar178._4_4_;
      auVar177._8_4_ = fVar114 * auVar178._8_4_;
      auVar177._12_4_ = fVar115 * auVar178._12_4_;
      auVar225._0_4_ = fVar230 * auVar141._0_4_;
      auVar225._4_4_ = fVar231 * auVar141._4_4_;
      auVar225._8_4_ = fVar114 * auVar141._8_4_;
      auVar225._12_4_ = fVar115 * auVar141._12_4_;
      auVar103._0_4_ = fVar200 * auVar178._0_4_;
      auVar103._4_4_ = fVar201 * auVar178._4_4_;
      auVar103._8_4_ = fVar202 * auVar178._8_4_;
      auVar103._12_4_ = fVar229 * auVar178._12_4_;
      auVar140._0_4_ = fVar200 * auVar141._0_4_;
      auVar140._4_4_ = fVar201 * auVar141._4_4_;
      auVar140._8_4_ = fVar202 * auVar141._8_4_;
      auVar140._12_4_ = fVar229 * auVar141._12_4_;
      auVar178 = vminps_avx(auVar177,auVar225);
      auVar141 = vminps_avx(auVar103,auVar140);
      auVar178 = vminps_avx(auVar178,auVar141);
      auVar141 = vmaxps_avx(auVar225,auVar177);
      auVar130 = vmaxps_avx(auVar140,auVar103);
      auVar178 = vhaddps_avx(auVar178,auVar178);
      auVar141 = vmaxps_avx(auVar130,auVar141);
      auVar141 = vhaddps_avx(auVar141,auVar141);
      auVar130 = vmovshdup_avx(auVar20);
      auVar168 = ZEXT416((uint)(auVar130._0_4_ + auVar178._0_4_));
      auVar178 = vmaxss_avx(auVar92,auVar168);
      auVar130 = ZEXT416((uint)(auVar130._0_4_ + auVar141._0_4_));
      auVar141 = vminss_avx(auVar130,auVar76);
      auVar352._8_4_ = 0x7fffffff;
      auVar352._0_8_ = 0x7fffffff7fffffff;
      auVar352._12_4_ = 0x7fffffff;
    } while (auVar141._0_4_ < auVar178._0_4_);
    uVar70 = 0;
    if ((fVar184 < fVar185) && (fVar199 < fVar151)) {
      auVar178 = vcmpps_avx(auVar130,auVar76,1);
      auVar141 = vcmpps_avx(auVar92,auVar168,1);
      auVar178 = vandps_avx(auVar141,auVar178);
      uVar70 = auVar178._0_4_;
    }
    if ((3 < uVar72 || fVar183 < 0.001) || (uVar70 & 1) != 0) {
      lVar69 = 200;
      do {
        fVar183 = auVar20._0_4_;
        fVar151 = 1.0 - fVar183;
        auVar178 = ZEXT416((uint)(fVar151 * fVar151 * fVar151));
        auVar178 = vshufps_avx(auVar178,auVar178,0);
        auVar141 = ZEXT416((uint)(fVar183 * 3.0 * fVar151 * fVar151));
        auVar141 = vshufps_avx(auVar141,auVar141,0);
        auVar130 = ZEXT416((uint)(fVar151 * fVar183 * fVar183 * 3.0));
        auVar130 = vshufps_avx(auVar130,auVar130,0);
        auVar168 = ZEXT416((uint)(fVar183 * fVar183 * fVar183));
        auVar168 = vshufps_avx(auVar168,auVar168,0);
        fVar151 = (float)local_630._0_4_ * auVar178._0_4_ +
                  local_640 * auVar141._0_4_ +
                  (float)local_4b0._0_4_ * auVar168._0_4_ + local_650 * auVar130._0_4_;
        fVar183 = (float)local_630._4_4_ * auVar178._4_4_ +
                  fStack_63c * auVar141._4_4_ +
                  (float)local_4b0._4_4_ * auVar168._4_4_ + fStack_64c * auVar130._4_4_;
        auVar104._0_8_ = CONCAT44(fVar183,fVar151);
        auVar104._8_4_ =
             fStack_628 * auVar178._8_4_ +
             fStack_638 * auVar141._8_4_ + fStack_4a8 * auVar168._8_4_ + fStack_648 * auVar130._8_4_
        ;
        auVar104._12_4_ =
             fStack_624 * auVar178._12_4_ +
             fStack_634 * auVar141._12_4_ +
             fStack_4a4 * auVar168._12_4_ + fStack_644 * auVar130._12_4_;
        auVar142._8_8_ = auVar104._0_8_;
        auVar142._0_8_ = auVar104._0_8_;
        auVar141 = vshufpd_avx(auVar104,auVar104,1);
        auVar178 = vmovshdup_avx(auVar20);
        auVar141 = vsubps_avx(auVar141,auVar142);
        auVar105._0_4_ = auVar178._0_4_ * auVar141._0_4_ + fVar151;
        auVar105._4_4_ = auVar178._4_4_ * auVar141._4_4_ + fVar183;
        auVar105._8_4_ = auVar178._8_4_ * auVar141._8_4_ + fVar151;
        auVar105._12_4_ = auVar178._12_4_ * auVar141._12_4_ + fVar183;
        auVar178 = vshufps_avx(auVar105,auVar105,0);
        auVar141 = vshufps_avx(auVar105,auVar105,0x55);
        auVar143._0_4_ = auVar88._0_4_ * auVar178._0_4_ + auVar124._0_4_ * auVar141._0_4_;
        auVar143._4_4_ = auVar88._4_4_ * auVar178._4_4_ + auVar124._4_4_ * auVar141._4_4_;
        auVar143._8_4_ = auVar88._8_4_ * auVar178._8_4_ + auVar124._8_4_ * auVar141._8_4_;
        auVar143._12_4_ = auVar88._12_4_ * auVar178._12_4_ + auVar124._12_4_ * auVar141._12_4_;
        auVar20 = vsubps_avx(auVar20,auVar143);
        auVar178 = vandps_avx(auVar352,auVar105);
        auVar141 = vshufps_avx(auVar178,auVar178,0xf5);
        auVar178 = vmaxss_avx(auVar141,auVar178);
        if (auVar178._0_4_ < (float)local_4c0._0_4_) {
          fVar151 = auVar20._0_4_;
          if ((0.0 <= fVar151) && (fVar151 <= 1.0)) {
            auVar88 = vmovshdup_avx(auVar20);
            fVar183 = auVar88._0_4_;
            if ((0.0 <= fVar183) && (fVar183 <= 1.0)) {
              auVar88 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar262 = vinsertps_avx(auVar88,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                       0x28);
              auVar88 = vdpps_avx(auVar262,local_380,0x7f);
              auVar124 = vdpps_avx(auVar262,local_390,0x7f);
              auVar178 = vdpps_avx(auVar262,local_3c0,0x7f);
              auVar141 = vdpps_avx(auVar262,local_3d0,0x7f);
              auVar130 = vdpps_avx(auVar262,local_3e0,0x7f);
              auVar168 = vdpps_avx(auVar262,local_3f0,0x7f);
              fVar201 = 1.0 - fVar183;
              auVar131 = vdpps_avx(auVar262,local_3a0,0x7f);
              auVar262 = vdpps_avx(auVar262,local_3b0,0x7f);
              fVar202 = 1.0 - fVar151;
              fVar184 = auVar20._4_4_;
              fVar185 = auVar20._8_4_;
              fVar199 = auVar20._12_4_;
              fVar200 = fVar202 * fVar151 * fVar151 * 3.0;
              auVar247._0_4_ = fVar151 * fVar151 * fVar151;
              auVar247._4_4_ = fVar184 * fVar184 * fVar184;
              auVar247._8_4_ = fVar185 * fVar185 * fVar185;
              auVar247._12_4_ = fVar199 * fVar199 * fVar199;
              fVar184 = fVar151 * 3.0 * fVar202 * fVar202;
              fVar185 = fVar202 * fVar202 * fVar202;
              fVar151 = (fVar201 * auVar88._0_4_ + fVar183 * auVar178._0_4_) * fVar185 +
                        (fVar201 * auVar124._0_4_ + fVar183 * auVar141._0_4_) * fVar184 +
                        fVar200 * (fVar201 * auVar131._0_4_ + fVar183 * auVar130._0_4_) +
                        auVar247._0_4_ * (auVar168._0_4_ * fVar183 + fVar201 * auVar262._0_4_);
              if ((fVar75 <= fVar151) &&
                 (fVar183 = *(float *)(ray + k * 4 + 0x100), fVar151 <= fVar183)) {
                pGVar12 = (context->scene->geometries).items[uVar67].ptr;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_00f2ef2f:
                  bVar66 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar66 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_f0 = vshufps_avx(auVar20,auVar20,0x55);
                  auVar288._8_4_ = 0x3f800000;
                  auVar288._0_8_ = 0x3f8000003f800000;
                  auVar288._12_4_ = 0x3f800000;
                  auVar88 = vsubps_avx(auVar288,local_f0);
                  fVar199 = local_f0._0_4_;
                  fVar201 = local_f0._4_4_;
                  fVar229 = local_f0._8_4_;
                  fVar230 = local_f0._12_4_;
                  fVar231 = auVar88._0_4_;
                  fVar114 = auVar88._4_4_;
                  fVar115 = auVar88._8_4_;
                  fVar116 = auVar88._12_4_;
                  auVar298._0_4_ =
                       fVar199 * (float)local_500._0_4_ + fVar231 * (float)local_4d0._0_4_;
                  auVar298._4_4_ =
                       fVar201 * (float)local_500._4_4_ + fVar114 * (float)local_4d0._4_4_;
                  auVar298._8_4_ = fVar229 * fStack_4f8 + fVar115 * fStack_4c8;
                  auVar298._12_4_ = fVar230 * fStack_4f4 + fVar116 * fStack_4c4;
                  auVar309._0_4_ = fVar199 * (float)local_510._0_4_ + fVar231 * fVar291;
                  auVar309._4_4_ = fVar201 * (float)local_510._4_4_ + fVar114 * fVar301;
                  auVar309._8_4_ = fVar229 * fStack_508 + fVar115 * fVar302;
                  auVar309._12_4_ = fVar230 * fStack_504 + fVar116 * fVar303;
                  auVar317._0_4_ =
                       fVar199 * (float)local_420._0_4_ + fVar231 * (float)local_4e0._0_4_;
                  auVar317._4_4_ =
                       fVar201 * (float)local_420._4_4_ + fVar114 * (float)local_4e0._4_4_;
                  auVar317._8_4_ = fVar229 * fStack_418 + fVar115 * fStack_4d8;
                  auVar317._12_4_ = fVar230 * fStack_414 + fVar116 * fStack_4d4;
                  auVar289._0_4_ = fVar199 * fVar233 + fVar231 * (float)local_4f0._0_4_;
                  auVar289._4_4_ = fVar201 * fVar251 + fVar114 * (float)local_4f0._4_4_;
                  auVar289._8_4_ = fVar229 * fVar232 + fVar115 * fStack_4e8;
                  auVar289._12_4_ = fVar230 * fVar74 + fVar116 * fStack_4e4;
                  auVar141 = vsubps_avx(auVar309,auVar298);
                  auVar130 = vsubps_avx(auVar317,auVar309);
                  auVar168 = vsubps_avx(auVar289,auVar317);
                  local_110 = vshufps_avx(auVar20,auVar20,0);
                  fVar199 = local_110._0_4_;
                  fVar229 = local_110._4_4_;
                  fVar230 = local_110._8_4_;
                  fVar114 = local_110._12_4_;
                  auVar88 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
                  fVar201 = auVar88._0_4_;
                  fVar202 = auVar88._4_4_;
                  fVar231 = auVar88._8_4_;
                  fVar115 = auVar88._12_4_;
                  auVar88 = vshufps_avx(auVar247,auVar247,0);
                  auVar124 = vshufps_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),0);
                  auVar178 = vshufps_avx(ZEXT416((uint)fVar184),ZEXT416((uint)fVar184),0);
                  auVar226._0_4_ =
                       ((auVar130._0_4_ * fVar201 + auVar168._0_4_ * fVar199) * fVar199 +
                       (auVar141._0_4_ * fVar201 + auVar130._0_4_ * fVar199) * fVar201) * 3.0;
                  auVar226._4_4_ =
                       ((auVar130._4_4_ * fVar202 + auVar168._4_4_ * fVar229) * fVar229 +
                       (auVar141._4_4_ * fVar202 + auVar130._4_4_ * fVar229) * fVar202) * 3.0;
                  auVar226._8_4_ =
                       ((auVar130._8_4_ * fVar231 + auVar168._8_4_ * fVar230) * fVar230 +
                       (auVar141._8_4_ * fVar231 + auVar130._8_4_ * fVar230) * fVar231) * 3.0;
                  auVar226._12_4_ =
                       ((auVar130._12_4_ * fVar115 + auVar168._12_4_ * fVar114) * fVar114 +
                       (auVar141._12_4_ * fVar115 + auVar130._12_4_ * fVar114) * fVar115) * 3.0;
                  auVar141 = vshufps_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),0);
                  auVar144._0_4_ =
                       auVar141._0_4_ * (float)local_430._0_4_ +
                       auVar178._0_4_ * (float)local_440._0_4_ +
                       auVar88._0_4_ * (float)local_460._0_4_ +
                       auVar124._0_4_ * (float)local_450._0_4_;
                  auVar144._4_4_ =
                       auVar141._4_4_ * (float)local_430._4_4_ +
                       auVar178._4_4_ * (float)local_440._4_4_ +
                       auVar88._4_4_ * (float)local_460._4_4_ +
                       auVar124._4_4_ * (float)local_450._4_4_;
                  auVar144._8_4_ =
                       auVar141._8_4_ * fStack_428 +
                       auVar178._8_4_ * fStack_438 +
                       auVar88._8_4_ * fStack_458 + auVar124._8_4_ * fStack_448;
                  auVar144._12_4_ =
                       auVar141._12_4_ * fStack_424 +
                       auVar178._12_4_ * fStack_434 +
                       auVar88._12_4_ * fStack_454 + auVar124._12_4_ * fStack_444;
                  auVar88 = vshufps_avx(auVar226,auVar226,0xc9);
                  auVar179._0_4_ = auVar144._0_4_ * auVar88._0_4_;
                  auVar179._4_4_ = auVar144._4_4_ * auVar88._4_4_;
                  auVar179._8_4_ = auVar144._8_4_ * auVar88._8_4_;
                  auVar179._12_4_ = auVar144._12_4_ * auVar88._12_4_;
                  auVar88 = vshufps_avx(auVar144,auVar144,0xc9);
                  auVar145._0_4_ = auVar226._0_4_ * auVar88._0_4_;
                  auVar145._4_4_ = auVar226._4_4_ * auVar88._4_4_;
                  auVar145._8_4_ = auVar226._8_4_ * auVar88._8_4_;
                  auVar145._12_4_ = auVar226._12_4_ * auVar88._12_4_;
                  auVar88 = vsubps_avx(auVar145,auVar179);
                  local_170 = vshufps_avx(auVar88,auVar88,0x55);
                  local_180[0] = (RTCHitN)local_170[0];
                  local_180[1] = (RTCHitN)local_170[1];
                  local_180[2] = (RTCHitN)local_170[2];
                  local_180[3] = (RTCHitN)local_170[3];
                  local_180[4] = (RTCHitN)local_170[4];
                  local_180[5] = (RTCHitN)local_170[5];
                  local_180[6] = (RTCHitN)local_170[6];
                  local_180[7] = (RTCHitN)local_170[7];
                  local_180[8] = (RTCHitN)local_170[8];
                  local_180[9] = (RTCHitN)local_170[9];
                  local_180[10] = (RTCHitN)local_170[10];
                  local_180[0xb] = (RTCHitN)local_170[0xb];
                  local_180[0xc] = (RTCHitN)local_170[0xc];
                  local_180[0xd] = (RTCHitN)local_170[0xd];
                  local_180[0xe] = (RTCHitN)local_170[0xe];
                  local_180[0xf] = (RTCHitN)local_170[0xf];
                  local_150 = vshufps_avx(auVar88,auVar88,0xaa);
                  local_160 = local_150;
                  local_130 = vshufps_avx(auVar88,auVar88,0);
                  local_140 = local_130;
                  local_120 = local_110;
                  local_100 = local_f0;
                  local_e0 = local_300._0_8_;
                  uStack_d8 = local_300._8_8_;
                  uStack_d0 = local_300._16_8_;
                  uStack_c8 = local_300._24_8_;
                  local_c0 = local_2e0._0_8_;
                  uStack_b8 = local_2e0._8_8_;
                  uStack_b0 = local_2e0._16_8_;
                  uStack_a8 = local_2e0._24_8_;
                  auVar107 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar151;
                  local_540 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar64 & 0xf) << 4));
                  local_530 = *(undefined1 (*) [16])
                               (mm_lookupmask_ps + (long)((int)uVar64 >> 4) * 0x10);
                  local_490.valid = (int *)local_540;
                  local_490.geometryUserPtr = pGVar12->userPtr;
                  local_490.context = context->user;
                  local_490.ray = (RTCRayN *)ray;
                  local_490.hit = local_180;
                  local_490.N = 8;
                  if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar12->occlusionFilterN)(&local_490);
                  }
                  auVar88 = vpcmpeqd_avx(local_540,ZEXT816(0) << 0x40);
                  auVar124 = vpcmpeqd_avx(local_530,ZEXT816(0) << 0x40);
                  auVar182._16_16_ = auVar124;
                  auVar182._0_16_ = auVar88;
                  auVar23 = auVar107 & ~auVar182;
                  if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar23 >> 0x7f,0) != '\0') ||
                        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar23 >> 0xbf,0) != '\0') ||
                      (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar23[0x1f] < '\0') {
                    p_Var17 = context->args->filter;
                    if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var17)(&local_490);
                    }
                    auVar88 = vpcmpeqd_avx(local_540,ZEXT816(0) << 0x40);
                    auVar124 = vpcmpeqd_avx(local_530,ZEXT816(0) << 0x40);
                    auVar113._16_16_ = auVar124;
                    auVar113._0_16_ = auVar88;
                    auVar150._8_4_ = 0xff800000;
                    auVar150._0_8_ = 0xff800000ff800000;
                    auVar150._12_4_ = 0xff800000;
                    auVar150._16_4_ = 0xff800000;
                    auVar150._20_4_ = 0xff800000;
                    auVar150._24_4_ = 0xff800000;
                    auVar150._28_4_ = 0xff800000;
                    auVar23 = vblendvps_avx(auVar150,*(undefined1 (*) [32])(local_490.ray + 0x100),
                                            auVar113);
                    *(undefined1 (*) [32])(local_490.ray + 0x100) = auVar23;
                    auVar107 = auVar107 & ~auVar113;
                    if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar107 >> 0x7f,0) != '\0') ||
                          (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar107 >> 0xbf,0) != '\0') ||
                        (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar107[0x1f] < '\0') {
                      bVar66 = 1;
                      goto LAB_00f2ef31;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar183;
                  goto LAB_00f2ef2f;
                }
LAB_00f2ef31:
                bVar73 = (bool)(bVar73 | bVar66);
              }
            }
          }
          break;
        }
        lVar69 = lVar69 + -1;
      } while (lVar69 != 0);
      goto LAB_00f2df39;
    }
    local_400 = vinsertps_avx(ZEXT416((uint)fVar184),ZEXT416((uint)fVar151),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }